

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  uint uVar71;
  uint uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined4 uVar77;
  undefined8 unaff_R13;
  ulong uVar78;
  ulong uVar79;
  bool bVar80;
  undefined8 uVar81;
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar87 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar112;
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar185;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar191 [32];
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar206;
  float fVar215;
  float fVar216;
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar217;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar214 [64];
  undefined1 auVar223 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [16];
  float fVar243;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  float fVar258;
  undefined1 auVar259 [28];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar260 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar261 [32];
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar267 [64];
  float s;
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar278 [32];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined8 local_8d0;
  float local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  Primitive *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar277 [16];
  
  PVar3 = prim[1];
  uVar78 = (ulong)(byte)PVar3;
  fVar185 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar89 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  auVar207._0_4_ = fVar185 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar207._4_4_ = fVar185 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar207._8_4_ = fVar185 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar207._12_4_ = fVar185 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar82._0_4_ = fVar185 * auVar89._0_4_;
  auVar82._4_4_ = fVar185 * auVar89._4_4_;
  auVar82._8_4_ = fVar185 * auVar89._8_4_;
  auVar82._12_4_ = fVar185 * auVar89._12_4_;
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar251 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar251 = vcvtdq2ps_avx(auVar251);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar267 = ZEXT1664(auVar84);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar276._4_4_ = auVar207._0_4_;
  auVar276._0_4_ = auVar207._0_4_;
  auVar276._8_4_ = auVar207._0_4_;
  auVar276._12_4_ = auVar207._0_4_;
  auVar131 = vshufps_avx(auVar207,auVar207,0x55);
  auVar83 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar185 = auVar83._0_4_;
  auVar250._0_4_ = fVar185 * auVar272._0_4_;
  fVar200 = auVar83._4_4_;
  auVar250._4_4_ = fVar200 * auVar272._4_4_;
  fVar201 = auVar83._8_4_;
  auVar250._8_4_ = fVar201 * auVar272._8_4_;
  fVar202 = auVar83._12_4_;
  auVar250._12_4_ = fVar202 * auVar272._12_4_;
  auVar244._0_4_ = auVar223._0_4_ * fVar185;
  auVar244._4_4_ = auVar223._4_4_ * fVar200;
  auVar244._8_4_ = auVar223._8_4_ * fVar201;
  auVar244._12_4_ = auVar223._12_4_ * fVar202;
  auVar233._0_4_ = auVar114._0_4_ * fVar185;
  auVar233._4_4_ = auVar114._4_4_ * fVar200;
  auVar233._8_4_ = auVar114._8_4_ * fVar201;
  auVar233._12_4_ = auVar114._12_4_ * fVar202;
  auVar83 = vfmadd231ps_fma(auVar250,auVar131,auVar89);
  auVar115 = vfmadd231ps_fma(auVar244,auVar131,auVar8);
  auVar131 = vfmadd231ps_fma(auVar233,auVar84,auVar131);
  auVar152 = vfmadd231ps_fma(auVar83,auVar276,auVar7);
  auVar256 = ZEXT1664(auVar152);
  auVar115 = vfmadd231ps_fma(auVar115,auVar276,auVar251);
  auVar168 = vfmadd231ps_fma(auVar131,auVar85,auVar276);
  auVar277._4_4_ = auVar82._0_4_;
  auVar277._0_4_ = auVar82._0_4_;
  auVar277._8_4_ = auVar82._0_4_;
  auVar277._12_4_ = auVar82._0_4_;
  auVar279 = ZEXT1664(auVar277);
  auVar131 = vshufps_avx(auVar82,auVar82,0x55);
  auVar83 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar185 = auVar83._0_4_;
  auVar208._0_4_ = fVar185 * auVar272._0_4_;
  fVar200 = auVar83._4_4_;
  auVar208._4_4_ = fVar200 * auVar272._4_4_;
  fVar201 = auVar83._8_4_;
  auVar208._8_4_ = fVar201 * auVar272._8_4_;
  fVar202 = auVar83._12_4_;
  auVar208._12_4_ = fVar202 * auVar272._12_4_;
  auVar113._0_4_ = auVar223._0_4_ * fVar185;
  auVar113._4_4_ = auVar223._4_4_ * fVar200;
  auVar113._8_4_ = auVar223._8_4_ * fVar201;
  auVar113._12_4_ = auVar223._12_4_ * fVar202;
  auVar83._0_4_ = auVar114._0_4_ * fVar185;
  auVar83._4_4_ = auVar114._4_4_ * fVar200;
  auVar83._8_4_ = auVar114._8_4_ * fVar201;
  auVar83._12_4_ = auVar114._12_4_ * fVar202;
  auVar89 = vfmadd231ps_fma(auVar208,auVar131,auVar89);
  auVar272 = vfmadd231ps_fma(auVar113,auVar131,auVar8);
  auVar8 = vfmadd231ps_fma(auVar83,auVar131,auVar84);
  auVar84 = vfmadd231ps_fma(auVar89,auVar277,auVar7);
  auVar114 = vfmadd231ps_fma(auVar272,auVar277,auVar251);
  local_970._8_4_ = 0x7fffffff;
  local_970._0_8_ = 0x7fffffff7fffffff;
  local_970._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar152,local_970);
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar221,1);
  auVar89 = vblendvps_avx(auVar152,auVar221,auVar7);
  auVar7 = vandps_avx(auVar115,local_970);
  auVar7 = vcmpps_avx(auVar7,auVar221,1);
  auVar272 = vblendvps_avx(auVar115,auVar221,auVar7);
  auVar7 = vandps_avx(auVar168,local_970);
  auVar7 = vcmpps_avx(auVar7,auVar221,1);
  auVar7 = vblendvps_avx(auVar168,auVar221,auVar7);
  auVar131 = vfmadd231ps_fma(auVar8,auVar277,auVar85);
  auVar251 = vrcpps_avx(auVar89);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar89,auVar251,auVar222);
  auVar251 = vfmadd132ps_fma(auVar89,auVar251,auVar251);
  auVar89 = vrcpps_avx(auVar272);
  auVar272 = vfnmadd213ps_fma(auVar272,auVar89,auVar222);
  auVar223 = vfmadd132ps_fma(auVar272,auVar89,auVar89);
  auVar89 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar89,auVar222);
  auVar85 = vfmadd132ps_fma(auVar7,auVar89,auVar89);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar84);
  auVar168._0_4_ = auVar251._0_4_ * auVar7._0_4_;
  auVar168._4_4_ = auVar251._4_4_ * auVar7._4_4_;
  auVar168._8_4_ = auVar251._8_4_ * auVar7._8_4_;
  auVar168._12_4_ = auVar251._12_4_ * auVar7._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar89);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar84);
  auVar186._0_4_ = auVar251._0_4_ * auVar7._0_4_;
  auVar186._4_4_ = auVar251._4_4_ * auVar7._4_4_;
  auVar186._8_4_ = auVar251._8_4_ * auVar7._8_4_;
  auVar186._12_4_ = auVar251._12_4_ * auVar7._12_4_;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar272);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar114);
  auVar209._0_4_ = auVar223._0_4_ * auVar7._0_4_;
  auVar209._4_4_ = auVar223._4_4_ * auVar7._4_4_;
  auVar209._8_4_ = auVar223._8_4_ * auVar7._8_4_;
  auVar209._12_4_ = auVar223._12_4_ * auVar7._12_4_;
  auVar115._1_3_ = 0;
  auVar115[0] = PVar3;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar251);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar89 = vsubps_avx(auVar7,auVar114);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar114._0_4_ = auVar223._0_4_ * auVar89._0_4_;
  auVar114._4_4_ = auVar223._4_4_ * auVar89._4_4_;
  auVar114._8_4_ = auVar223._8_4_ * auVar89._8_4_;
  auVar114._12_4_ = auVar223._12_4_ * auVar89._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar131);
  auVar152._0_4_ = auVar85._0_4_ * auVar7._0_4_;
  auVar152._4_4_ = auVar85._4_4_ * auVar7._4_4_;
  auVar152._8_4_ = auVar85._8_4_ * auVar7._8_4_;
  auVar152._12_4_ = auVar85._12_4_ * auVar7._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar223);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar131);
  auVar84._0_4_ = auVar85._0_4_ * auVar7._0_4_;
  auVar84._4_4_ = auVar85._4_4_ * auVar7._4_4_;
  auVar84._8_4_ = auVar85._8_4_ * auVar7._8_4_;
  auVar84._12_4_ = auVar85._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar168,auVar186);
  auVar89 = vpminsd_avx(auVar209,auVar114);
  auVar7 = vmaxps_avx(auVar7,auVar89);
  auVar89 = vpminsd_avx(auVar152,auVar84);
  uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar245._4_4_ = uVar77;
  auVar245._0_4_ = uVar77;
  auVar245._8_4_ = uVar77;
  auVar245._12_4_ = uVar77;
  auVar89 = vmaxps_avx(auVar89,auVar245);
  auVar7 = vmaxps_avx(auVar7,auVar89);
  local_5a0._0_4_ = auVar7._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar7._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar7._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar168,auVar186);
  auVar89 = vpmaxsd_avx(auVar209,auVar114);
  auVar7 = vminps_avx(auVar7,auVar89);
  auVar89 = vpmaxsd_avx(auVar152,auVar84);
  fVar185 = (ray->super_RayK<1>).tfar;
  auVar131._4_4_ = fVar185;
  auVar131._0_4_ = fVar185;
  auVar131._8_4_ = fVar185;
  auVar131._12_4_ = fVar185;
  auVar89 = vminps_avx(auVar89,auVar131);
  auVar7 = vminps_avx(auVar7,auVar89);
  auVar85._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar115[4] = PVar3;
  auVar115._5_3_ = 0;
  auVar115[8] = PVar3;
  auVar115._9_3_ = 0;
  auVar115[0xc] = PVar3;
  auVar115._13_3_ = 0;
  auVar89 = vpcmpgtd_avx(auVar115,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_5a0,auVar85,2);
  auVar7 = vandps_avx(auVar7,auVar89);
  uVar77 = vmovmskps_avx(auVar7);
  uVar78 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar77);
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  local_808 = prim;
LAB_0116288a:
  if (uVar78 == 0) {
    return;
  }
  lVar73 = 0;
  for (uVar75 = uVar78; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  uVar72 = *(uint *)(local_808 + 2);
  pGVar4 = (context->scene->geometries).items[uVar72].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(local_808 + lVar73 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar75);
  auVar89 = *(undefined1 (*) [16])(lVar6 + (uVar75 + 1) * (long)p_Var5);
  uVar78 = uVar78 - 1 & uVar78;
  if (uVar78 != 0) {
    uVar76 = uVar78 - 1 & uVar78;
    for (uVar79 = uVar78; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar187._0_4_ = (auVar7._0_4_ + auVar89._0_4_) * 0.5;
  auVar187._4_4_ = (auVar7._4_4_ + auVar89._4_4_) * 0.5;
  auVar187._8_4_ = (auVar7._8_4_ + auVar89._8_4_) * 0.5;
  auVar187._12_4_ = (auVar7._12_4_ + auVar89._12_4_) * 0.5;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar272 = vsubps_avx(auVar187,(undefined1  [16])aVar1);
  auVar272 = vdpps_avx(auVar272,(undefined1  [16])aVar2,0x7f);
  auVar251 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar8 = vrcpss_avx(auVar251,auVar251);
  auVar251 = vfnmadd213ss_fma(auVar8,auVar251,ZEXT416(0x40000000));
  fVar185 = auVar272._0_4_ * auVar8._0_4_ * auVar251._0_4_;
  local_820 = ZEXT416((uint)fVar185);
  auVar188._4_4_ = fVar185;
  auVar188._0_4_ = fVar185;
  auVar188._8_4_ = fVar185;
  auVar188._12_4_ = fVar185;
  local_800._16_4_ = fVar185;
  local_800._0_16_ = auVar188;
  local_800._20_4_ = fVar185;
  local_800._24_4_ = fVar185;
  local_800._28_4_ = fVar185;
  auVar272 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar188);
  auVar272 = vblendps_avx(auVar272,_DAT_01f45a50,8);
  local_930 = vsubps_avx(auVar7,auVar272);
  local_940 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar75 + 2) * (long)p_Var5),auVar272);
  local_950 = vsubps_avx(auVar89,auVar272);
  auVar214 = ZEXT1664(local_950);
  _local_960 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar75 + 3) * (long)p_Var5),auVar272);
  auVar7 = vmovshdup_avx(local_930);
  uVar81 = auVar7._0_8_;
  auVar284._8_8_ = uVar81;
  auVar284._0_8_ = uVar81;
  auVar284._16_8_ = uVar81;
  auVar284._24_8_ = uVar81;
  auVar89 = vshufps_avx(local_930,local_930,0xaa);
  local_1e0 = auVar89._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar89 = vshufps_avx(local_930,local_930,0xff);
  local_200 = auVar89._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar89 = vmovshdup_avx(local_950);
  local_380 = auVar89._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar89 = vshufps_avx(local_950,local_950,0xaa);
  local_3a0 = auVar89._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar89 = vshufps_avx(local_950,local_950,0xff);
  local_3c0 = auVar89._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar89 = vmovshdup_avx(local_940);
  local_3e0 = auVar89._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar89 = vshufps_avx(local_940,local_940,0xaa);
  local_400 = auVar89._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar89 = vshufps_avx(local_940,local_940,0xff);
  local_420 = auVar89._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar89 = vmovshdup_avx(_local_960);
  local_440 = auVar89._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar89 = vshufps_avx(_local_960,_local_960,0xaa);
  local_460 = auVar89._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar89 = vshufps_avx(_local_960,_local_960,0xff);
  local_480 = auVar89._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar86._0_4_ = aVar2.x * aVar2.x;
  auVar86._4_4_ = aVar2.y * aVar2.y;
  auVar86._8_4_ = aVar2.z * aVar2.z;
  auVar86._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar89 = vshufps_avx(auVar86,auVar86,0xaa);
  uVar81 = auVar89._0_8_;
  auVar194._8_8_ = uVar81;
  auVar194._0_8_ = uVar81;
  auVar194._16_8_ = uVar81;
  auVar194._24_8_ = uVar81;
  uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_5c0._4_4_ = uVar77;
  local_5c0._0_4_ = uVar77;
  fStack_5b8 = (float)uVar77;
  fStack_5b4 = (float)uVar77;
  fStack_5b0 = (float)uVar77;
  fStack_5ac = (float)uVar77;
  fStack_5a8 = (float)uVar77;
  register0x000013dc = uVar77;
  auVar230 = ZEXT3264(_local_5c0);
  auVar89 = vfmadd231ps_fma(auVar194,_local_5c0,_local_5c0);
  uVar77 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_660._4_4_ = uVar77;
  local_660._0_4_ = uVar77;
  fStack_658 = (float)uVar77;
  fStack_654 = (float)uVar77;
  fStack_650 = (float)uVar77;
  fStack_64c = (float)uVar77;
  fStack_648 = (float)uVar77;
  register0x0000141c = uVar77;
  auVar240 = ZEXT3264(_local_660);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),_local_660,_local_660);
  uVar79 = 0;
  local_aec = 1;
  local_680 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  local_240 = local_930._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_4a0 = local_950._0_4_;
  uStack_49c = local_4a0;
  uStack_498 = local_4a0;
  uStack_494 = local_4a0;
  uStack_490 = local_4a0;
  uStack_48c = local_4a0;
  uStack_488 = local_4a0;
  uStack_484 = local_4a0;
  local_4c0 = local_940._0_4_;
  uStack_4bc = local_4c0;
  uStack_4b8 = local_4c0;
  uStack_4b4 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4ac = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_4a4 = local_4c0;
  local_4e0 = local_960._0_4_;
  local_6c0._8_4_ = 0x7fffffff;
  local_6c0._0_8_ = 0x7fffffff7fffffff;
  local_6c0._12_4_ = 0x7fffffff;
  local_6c0._16_4_ = 0x7fffffff;
  local_6c0._20_4_ = 0x7fffffff;
  local_6c0._24_4_ = 0x7fffffff;
  local_6c0._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(ZEXT1632(auVar89),local_6c0);
  local_590 = ZEXT816(0x3f80000000000000);
  local_220 = ZEXT1632(auVar89);
  fStack_4dc = local_4e0;
  fStack_4d8 = local_4e0;
  fStack_4d4 = local_4e0;
  fStack_4d0 = local_4e0;
  fStack_4cc = local_4e0;
  fStack_4c8 = local_4e0;
  fStack_4c4 = local_4e0;
  uVar75 = (ulong)*(uint *)(local_808 + lVar73 * 4 + 6);
  do {
    auVar89 = vmovshdup_avx(local_590);
    auVar89 = vsubps_avx(auVar89,local_590);
    local_740._0_4_ = auVar89._0_4_;
    fVar151 = local_740._0_4_ * 0.04761905;
    local_a60._0_16_ = ZEXT416((uint)fVar151);
    uVar77 = local_590._0_4_;
    local_880._4_4_ = uVar77;
    local_880._0_4_ = uVar77;
    local_880._8_4_ = uVar77;
    local_880._12_4_ = uVar77;
    local_880._16_4_ = uVar77;
    local_880._20_4_ = uVar77;
    local_880._24_4_ = uVar77;
    local_880._28_4_ = uVar77;
    local_740._4_4_ = local_740._0_4_;
    local_740._8_4_ = local_740._0_4_;
    local_740._12_4_ = local_740._0_4_;
    local_740._16_4_ = local_740._0_4_;
    local_740._20_4_ = local_740._0_4_;
    local_740._24_4_ = local_740._0_4_;
    local_740._28_4_ = local_740._0_4_;
    auVar89 = vfmadd231ps_fma(local_880,local_740,_DAT_01f7b040);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar98 = vsubps_avx(auVar99,ZEXT1632(auVar89));
    fVar185 = auVar89._0_4_;
    fVar201 = auVar89._4_4_;
    fVar203 = auVar89._8_4_;
    fVar205 = auVar89._12_4_;
    auVar231._28_36_ = auVar230._28_36_;
    auVar231._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * fVar205,
                            CONCAT48(fVar203 * fVar203,CONCAT44(fVar201 * fVar201,fVar185 * fVar185)
                                    )));
    fVar232 = fVar185 * 3.0;
    fVar241 = fVar201 * 3.0;
    fVar242 = fVar203 * 3.0;
    fVar243 = fVar205 * 3.0;
    fVar200 = auVar98._0_4_;
    auVar257._0_4_ = fVar200 * fVar200;
    fVar202 = auVar98._4_4_;
    auVar257._4_4_ = fVar202 * fVar202;
    fVar204 = auVar98._8_4_;
    auVar257._8_4_ = fVar204 * fVar204;
    fVar181 = auVar98._12_4_;
    auVar257._12_4_ = fVar181 * fVar181;
    fVar182 = auVar98._16_4_;
    auVar257._16_4_ = fVar182 * fVar182;
    fVar183 = auVar98._20_4_;
    auVar257._20_4_ = fVar183 * fVar183;
    fVar184 = auVar98._24_4_;
    auVar257._28_36_ = auVar256._28_36_;
    auVar257._24_4_ = fVar184 * fVar184;
    fVar112 = auVar98._28_4_;
    auVar256._0_4_ = (auVar257._0_4_ * (fVar200 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._4_4_ = (auVar257._4_4_ * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._8_4_ = (auVar257._8_4_ * (fVar204 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._12_4_ = (auVar257._12_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._16_4_ = (auVar257._16_4_ * (fVar182 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._20_4_ = (auVar257._20_4_ * (fVar183 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar256._28_36_ = auVar267._28_36_;
    auVar256._24_4_ = (auVar257._24_4_ * (fVar184 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar98 = auVar256._0_32_;
    fVar206 = fVar185 * fVar185 * -fVar200 * 0.5;
    fVar215 = fVar201 * fVar201 * -fVar202 * 0.5;
    fVar216 = fVar203 * fVar203 * -fVar204 * 0.5;
    fVar217 = fVar205 * fVar205 * -fVar181 * 0.5;
    fVar218 = -fVar182 * 0.0 * 0.0 * 0.5;
    fVar219 = -fVar183 * 0.0 * 0.0 * 0.5;
    fVar220 = -fVar184 * 0.0 * 0.0 * 0.5;
    auVar266._4_4_ = fStack_4dc * fVar215;
    auVar266._0_4_ = local_4e0 * fVar206;
    auVar266._8_4_ = fStack_4d8 * fVar216;
    auVar266._12_4_ = fStack_4d4 * fVar217;
    auVar266._16_4_ = fStack_4d0 * fVar218;
    auVar266._20_4_ = fStack_4cc * fVar219;
    auVar266._24_4_ = fStack_4c8 * fVar220;
    auVar266._28_4_ = fStack_4c4;
    auVar280._0_4_ = fVar206 * (float)local_440;
    auVar280._4_4_ = fVar215 * local_440._4_4_;
    auVar280._8_4_ = fVar216 * (float)uStack_438;
    auVar280._12_4_ = fVar217 * uStack_438._4_4_;
    auVar280._16_4_ = fVar218 * (float)uStack_430;
    auVar280._20_4_ = fVar219 * uStack_430._4_4_;
    auVar280._28_36_ = auVar279._28_36_;
    auVar280._24_4_ = fVar220 * (float)uStack_428;
    auVar238._4_4_ = fVar215 * local_460._4_4_;
    auVar238._0_4_ = fVar206 * (float)local_460;
    auVar238._8_4_ = fVar216 * (float)uStack_458;
    auVar238._12_4_ = fVar217 * uStack_458._4_4_;
    auVar238._16_4_ = fVar218 * (float)uStack_450;
    auVar238._20_4_ = fVar219 * uStack_450._4_4_;
    auVar238._24_4_ = fVar220 * (float)uStack_448;
    auVar238._28_4_ = 0x40000000;
    auVar165._4_4_ = fVar215 * local_480._4_4_;
    auVar165._0_4_ = fVar206 * (float)local_480;
    auVar165._8_4_ = fVar216 * (float)uStack_478;
    auVar165._12_4_ = fVar217 * uStack_478._4_4_;
    auVar165._16_4_ = fVar218 * (float)uStack_470;
    auVar165._20_4_ = fVar219 * uStack_470._4_4_;
    auVar165._24_4_ = fVar220 * (float)uStack_468;
    auVar165._28_4_ = auVar214._28_4_;
    auVar49._4_4_ = uStack_4bc;
    auVar49._0_4_ = local_4c0;
    auVar49._8_4_ = uStack_4b8;
    auVar49._12_4_ = uStack_4b4;
    auVar49._16_4_ = uStack_4b0;
    auVar49._20_4_ = uStack_4ac;
    auVar49._24_4_ = uStack_4a8;
    auVar49._28_4_ = uStack_4a4;
    auVar89 = vfmadd231ps_fma(auVar266,auVar98,auVar49);
    auVar57._8_8_ = uStack_3d8;
    auVar57._0_8_ = local_3e0;
    auVar57._16_8_ = uStack_3d0;
    auVar57._24_8_ = uStack_3c8;
    auVar272 = vfmadd231ps_fma(auVar280._0_32_,auVar98,auVar57);
    auVar55._8_8_ = uStack_3f8;
    auVar55._0_8_ = local_400;
    auVar55._16_8_ = uStack_3f0;
    auVar55._24_8_ = uStack_3e8;
    auVar251 = vfmadd231ps_fma(auVar238,auVar98,auVar55);
    auVar53._8_8_ = uStack_418;
    auVar53._0_8_ = local_420;
    auVar53._16_8_ = uStack_410;
    auVar53._24_8_ = uStack_408;
    auVar8 = vfmadd231ps_fma(auVar165,auVar98,auVar53);
    auVar127._4_4_ = ((fVar241 + -5.0) * fVar201 * fVar201 + 2.0) * 0.5;
    auVar127._0_4_ = ((fVar232 + -5.0) * fVar185 * fVar185 + 2.0) * 0.5;
    auVar127._8_4_ = ((fVar242 + -5.0) * fVar203 * fVar203 + 2.0) * 0.5;
    auVar127._12_4_ = ((fVar243 + -5.0) * fVar205 * fVar205 + 2.0) * 0.5;
    auVar127._16_4_ = 0x3f800000;
    auVar127._20_4_ = 0x3f800000;
    auVar127._24_4_ = 0x3f800000;
    auVar127._28_4_ = auVar267._28_4_ + 2.0;
    auVar51._4_4_ = uStack_49c;
    auVar51._0_4_ = local_4a0;
    auVar51._8_4_ = uStack_498;
    auVar51._12_4_ = uStack_494;
    auVar51._16_4_ = uStack_490;
    auVar51._20_4_ = uStack_48c;
    auVar51._24_4_ = uStack_488;
    auVar51._28_4_ = uStack_484;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar127,auVar51);
    auVar63._8_8_ = uStack_378;
    auVar63._0_8_ = local_380;
    auVar63._16_8_ = uStack_370;
    auVar63._24_8_ = uStack_368;
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar127,auVar63);
    auVar61._8_8_ = uStack_398;
    auVar61._0_8_ = local_3a0;
    auVar61._16_8_ = uStack_390;
    auVar61._24_8_ = uStack_388;
    auVar251 = vfmadd231ps_fma(ZEXT1632(auVar251),auVar127,auVar61);
    auVar59._8_8_ = uStack_3b8;
    auVar59._0_8_ = local_3c0;
    auVar59._16_8_ = uStack_3b0;
    auVar59._24_8_ = uStack_3a8;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar127,auVar59);
    local_8a0._8_4_ = 0x80000000;
    local_8a0._0_8_ = 0x8000000080000000;
    local_8a0._12_4_ = 0x80000000;
    local_8a0._16_4_ = 0x80000000;
    local_8a0._20_4_ = 0x80000000;
    local_8a0._24_4_ = 0x80000000;
    local_8a0._28_4_ = 0x80000000;
    auVar12._4_4_ = -fVar201 * fVar202 * fVar202 * 0.5;
    auVar12._0_4_ = -fVar185 * fVar200 * fVar200 * 0.5;
    auVar12._8_4_ = -fVar203 * fVar204 * fVar204 * 0.5;
    auVar12._12_4_ = -fVar205 * fVar181 * fVar181 * 0.5;
    auVar12._16_4_ = fVar182 * -0.0 * fVar182 * 0.5;
    auVar12._20_4_ = fVar183 * -0.0 * fVar183 * 0.5;
    auVar12._24_4_ = fVar184 * -0.0 * fVar184 * 0.5;
    auVar12._28_4_ = 0x80000000;
    auVar67._4_4_ = uStack_23c;
    auVar67._0_4_ = local_240;
    auVar67._8_4_ = uStack_238;
    auVar67._12_4_ = uStack_234;
    auVar67._16_4_ = uStack_230;
    auVar67._20_4_ = uStack_22c;
    auVar67._24_4_ = uStack_228;
    auVar67._28_4_ = uStack_224;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar12,auVar67);
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar12,auVar284);
    auVar69._8_8_ = uStack_1d8;
    auVar69._0_8_ = local_1e0;
    auVar69._16_8_ = uStack_1d0;
    auVar69._24_8_ = uStack_1c8;
    auVar251 = vfmadd231ps_fma(ZEXT1632(auVar251),auVar12,auVar69);
    auVar68._8_8_ = uStack_1f8;
    auVar68._0_8_ = local_200;
    auVar68._16_8_ = uStack_1f0;
    auVar68._24_8_ = uStack_1e8;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar68,auVar12);
    auVar191._0_4_ = (fVar200 + fVar200) * fVar185;
    auVar191._4_4_ = (fVar202 + fVar202) * fVar201;
    auVar191._8_4_ = (fVar204 + fVar204) * fVar203;
    auVar191._12_4_ = (fVar181 + fVar181) * fVar205;
    auVar191._16_4_ = (fVar182 + fVar182) * 0.0;
    auVar191._20_4_ = (fVar183 + fVar183) * 0.0;
    auVar191._24_4_ = (fVar184 + fVar184) * 0.0;
    auVar191._28_4_ = 0;
    auVar98 = vsubps_avx(auVar191,auVar257._0_32_);
    fVar206 = auVar240._28_4_ + 2.0;
    auVar13._4_4_ = (fVar202 + fVar202) * (fVar241 + 2.0);
    auVar13._0_4_ = (fVar200 + fVar200) * (fVar232 + 2.0);
    auVar13._8_4_ = (fVar204 + fVar204) * (fVar242 + 2.0);
    auVar13._12_4_ = (fVar181 + fVar181) * (fVar243 + 2.0);
    auVar13._16_4_ = (fVar182 + fVar182) * 2.0;
    auVar13._20_4_ = (fVar183 + fVar183) * 2.0;
    auVar13._24_4_ = (fVar184 + fVar184) * 2.0;
    auVar13._28_4_ = fVar206;
    auVar142._4_4_ = fVar202 * fVar202 * 3.0;
    auVar142._0_4_ = fVar200 * fVar200 * 3.0;
    auVar142._8_4_ = fVar204 * fVar204 * 3.0;
    auVar142._12_4_ = fVar181 * fVar181 * 3.0;
    auVar142._16_4_ = fVar182 * fVar182 * 3.0;
    auVar142._20_4_ = fVar183 * fVar183 * 3.0;
    auVar142._24_4_ = fVar184 * fVar184 * 3.0;
    auVar142._28_4_ = fVar112;
    auVar194 = vsubps_avx(auVar13,auVar142);
    auVar266 = vsubps_avx(auVar231._0_32_,auVar191);
    auVar177._4_4_ = auVar98._4_4_ * 0.5;
    auVar177._0_4_ = auVar98._0_4_ * 0.5;
    auVar177._8_4_ = auVar98._8_4_ * 0.5;
    auVar177._12_4_ = auVar98._12_4_ * 0.5;
    auVar177._16_4_ = auVar98._16_4_ * 0.5;
    auVar177._20_4_ = auVar98._20_4_ * 0.5;
    auVar177._24_4_ = auVar98._24_4_ * 0.5;
    auVar177._28_4_ = auVar230._28_4_;
    auVar260._28_4_ = fVar206;
    auVar260._0_28_ =
         ZEXT1628(CONCAT412((fVar243 * fVar205 + (fVar205 + fVar205) * (fVar243 + -5.0)) * 0.5,
                            CONCAT48((fVar242 * fVar203 + (fVar203 + fVar203) * (fVar242 + -5.0)) *
                                     0.5,CONCAT44((fVar241 * fVar201 +
                                                  (fVar201 + fVar201) * (fVar241 + -5.0)) * 0.5,
                                                  (fVar232 * fVar185 +
                                                  (fVar185 + fVar185) * (fVar232 + -5.0)) * 0.5))));
    auVar273._4_4_ = auVar194._4_4_ * 0.5;
    auVar273._0_4_ = auVar194._0_4_ * 0.5;
    auVar273._8_4_ = auVar194._8_4_ * 0.5;
    auVar273._12_4_ = auVar194._12_4_ * 0.5;
    auVar273._16_4_ = auVar194._16_4_ * 0.5;
    auVar273._20_4_ = auVar194._20_4_ * 0.5;
    auVar273._24_4_ = auVar194._24_4_ * 0.5;
    auVar273._28_4_ = auVar194._28_4_;
    fVar185 = auVar266._0_4_ * 0.5;
    fVar200 = auVar266._4_4_ * 0.5;
    fVar201 = auVar266._8_4_ * 0.5;
    fVar202 = auVar266._12_4_ * 0.5;
    fVar203 = auVar266._16_4_ * 0.5;
    fVar204 = auVar266._20_4_ * 0.5;
    fVar205 = auVar266._24_4_ * 0.5;
    auVar285._4_4_ = fVar200 * fStack_4dc;
    auVar285._0_4_ = fVar185 * local_4e0;
    auVar285._8_4_ = fVar201 * fStack_4d8;
    auVar285._12_4_ = fVar202 * fStack_4d4;
    auVar285._16_4_ = fVar203 * fStack_4d0;
    auVar285._20_4_ = fVar204 * fStack_4cc;
    auVar285._24_4_ = fVar205 * fStack_4c8;
    auVar285._28_4_ = 0x3f000000;
    auVar9._4_4_ = fVar200 * local_440._4_4_;
    auVar9._0_4_ = fVar185 * (float)local_440;
    auVar9._8_4_ = fVar201 * (float)uStack_438;
    auVar9._12_4_ = fVar202 * uStack_438._4_4_;
    auVar9._16_4_ = fVar203 * (float)uStack_430;
    auVar9._20_4_ = fVar204 * uStack_430._4_4_;
    auVar9._24_4_ = fVar205 * (float)uStack_428;
    auVar9._28_4_ = auVar98._28_4_;
    auVar10._4_4_ = fVar200 * local_460._4_4_;
    auVar10._0_4_ = fVar185 * (float)local_460;
    auVar10._8_4_ = fVar201 * (float)uStack_458;
    auVar10._12_4_ = fVar202 * uStack_458._4_4_;
    auVar10._16_4_ = fVar203 * (float)uStack_450;
    auVar10._20_4_ = fVar204 * uStack_450._4_4_;
    auVar10._24_4_ = fVar205 * (float)uStack_448;
    auVar10._28_4_ = auVar240._28_4_ + -5.0 + 0.0;
    auVar14._4_4_ = fVar200 * local_480._4_4_;
    auVar14._0_4_ = fVar185 * (float)local_480;
    auVar14._8_4_ = fVar201 * (float)uStack_478;
    auVar14._12_4_ = fVar202 * uStack_478._4_4_;
    auVar14._16_4_ = fVar203 * (float)uStack_470;
    auVar14._20_4_ = fVar204 * uStack_470._4_4_;
    auVar14._24_4_ = fVar205 * (float)uStack_468;
    auVar14._28_4_ = fVar112 + fVar112;
    auVar50._4_4_ = uStack_4bc;
    auVar50._0_4_ = local_4c0;
    auVar50._8_4_ = uStack_4b8;
    auVar50._12_4_ = uStack_4b4;
    auVar50._16_4_ = uStack_4b0;
    auVar50._20_4_ = uStack_4ac;
    auVar50._24_4_ = uStack_4a8;
    auVar50._28_4_ = uStack_4a4;
    auVar223 = vfmadd231ps_fma(auVar285,auVar273,auVar50);
    auVar58._8_8_ = uStack_3d8;
    auVar58._0_8_ = local_3e0;
    auVar58._16_8_ = uStack_3d0;
    auVar58._24_8_ = uStack_3c8;
    auVar85 = vfmadd231ps_fma(auVar9,auVar273,auVar58);
    auVar56._8_8_ = uStack_3f8;
    auVar56._0_8_ = local_400;
    auVar56._16_8_ = uStack_3f0;
    auVar56._24_8_ = uStack_3e8;
    auVar84 = vfmadd231ps_fma(auVar10,auVar273,auVar56);
    auVar54._8_8_ = uStack_418;
    auVar54._0_8_ = local_420;
    auVar54._16_8_ = uStack_410;
    auVar54._24_8_ = uStack_408;
    auVar114 = vfmadd231ps_fma(auVar14,auVar273,auVar54);
    auVar52._4_4_ = uStack_49c;
    auVar52._0_4_ = local_4a0;
    auVar52._8_4_ = uStack_498;
    auVar52._12_4_ = uStack_494;
    auVar52._16_4_ = uStack_490;
    auVar52._20_4_ = uStack_48c;
    auVar52._24_4_ = uStack_488;
    auVar52._28_4_ = uStack_484;
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar260,auVar52);
    auVar64._8_8_ = uStack_378;
    auVar64._0_8_ = local_380;
    auVar64._16_8_ = uStack_370;
    auVar64._24_8_ = uStack_368;
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar260,auVar64);
    auVar62._8_8_ = uStack_398;
    auVar62._0_8_ = local_3a0;
    auVar62._16_8_ = uStack_390;
    auVar62._24_8_ = uStack_388;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar260,auVar62);
    auVar60._8_8_ = uStack_3b8;
    auVar60._0_8_ = local_3c0;
    auVar60._16_8_ = uStack_3b0;
    auVar60._24_8_ = uStack_3a8;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar260,auVar60);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar177,auVar67);
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar177,auVar284);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar177,auVar69);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar68,auVar177);
    fVar203 = auVar223._0_4_ * fVar151;
    fVar204 = auVar223._4_4_ * fVar151;
    local_900._4_4_ = fVar204;
    local_900._0_4_ = fVar203;
    fVar205 = auVar223._8_4_ * fVar151;
    local_900._8_4_ = fVar205;
    fVar220 = auVar223._12_4_ * fVar151;
    local_900._12_4_ = fVar220;
    local_900._16_4_ = fVar151 * 0.0;
    local_900._20_4_ = fVar151 * 0.0;
    local_900._24_4_ = fVar151 * 0.0;
    local_900._28_4_ = auVar7._4_4_;
    local_9c0._0_4_ = auVar85._0_4_ * fVar151;
    local_9c0._4_4_ = auVar85._4_4_ * fVar151;
    local_9c0._8_4_ = auVar85._8_4_ * fVar151;
    local_9c0._12_4_ = auVar85._12_4_ * fVar151;
    local_9c0._16_4_ = fVar151 * 0.0;
    local_9c0._20_4_ = fVar151 * 0.0;
    local_9c0._24_4_ = fVar151 * 0.0;
    local_9c0._28_4_ = 0;
    fVar112 = auVar84._0_4_ * fVar151;
    fVar206 = auVar84._4_4_ * fVar151;
    local_720._4_4_ = fVar206;
    local_720._0_4_ = fVar112;
    fVar215 = auVar84._8_4_ * fVar151;
    local_720._8_4_ = fVar215;
    fVar216 = auVar84._12_4_ * fVar151;
    local_720._12_4_ = fVar216;
    fVar217 = fVar151 * 0.0;
    local_720._16_4_ = fVar217;
    fVar218 = fVar151 * 0.0;
    local_720._20_4_ = fVar218;
    fVar219 = fVar151 * 0.0;
    local_720._24_4_ = fVar219;
    local_720._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar185 = auVar114._0_4_ * fVar151;
    fVar200 = auVar114._4_4_ * fVar151;
    auVar15._4_4_ = fVar200;
    auVar15._0_4_ = fVar185;
    fVar201 = auVar114._8_4_ * fVar151;
    auVar15._8_4_ = fVar201;
    fVar202 = auVar114._12_4_ * fVar151;
    auVar15._12_4_ = fVar202;
    auVar15._16_4_ = fVar151 * 0.0;
    auVar15._20_4_ = fVar151 * 0.0;
    auVar15._24_4_ = fVar151 * 0.0;
    auVar15._28_4_ = fVar151;
    local_a40 = ZEXT1632(auVar89);
    _local_860 = vpermps_avx2(_DAT_01fb7720,local_a40);
    auVar273 = ZEXT1632(auVar251);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,auVar273);
    local_280 = vsubps_avx(_local_860,ZEXT1632(auVar89));
    local_260 = vsubps_avx(local_9a0,ZEXT1632(auVar251));
    fVar181 = local_260._0_4_;
    fVar182 = local_260._4_4_;
    auVar16._4_4_ = fVar182 * fVar204;
    auVar16._0_4_ = fVar181 * fVar203;
    fVar183 = local_260._8_4_;
    auVar16._8_4_ = fVar183 * fVar205;
    fVar184 = local_260._12_4_;
    auVar16._12_4_ = fVar184 * fVar220;
    fVar243 = local_260._16_4_;
    auVar16._16_4_ = fVar243 * fVar151 * 0.0;
    fVar167 = local_260._20_4_;
    auVar16._20_4_ = fVar167 * fVar151 * 0.0;
    fVar258 = local_260._24_4_;
    auVar16._24_4_ = fVar258 * fVar151 * 0.0;
    auVar16._28_4_ = auVar230._28_4_;
    auVar89 = vfmsub231ps_fma(auVar16,local_720,local_280);
    local_620 = ZEXT1632(auVar272);
    local_700 = vpermps_avx2(_DAT_01fb7720,local_620);
    local_2a0 = vsubps_avx(local_700,ZEXT1632(auVar272));
    fVar262 = local_280._0_4_;
    fVar263 = local_280._4_4_;
    auVar17._4_4_ = fVar263 * local_9c0._4_4_;
    auVar17._0_4_ = fVar262 * (float)local_9c0._0_4_;
    fVar264 = local_280._8_4_;
    auVar17._8_4_ = fVar264 * local_9c0._8_4_;
    fVar268 = local_280._12_4_;
    auVar17._12_4_ = fVar268 * local_9c0._12_4_;
    fVar269 = local_280._16_4_;
    auVar17._16_4_ = fVar269 * local_9c0._16_4_;
    fVar270 = local_280._20_4_;
    auVar17._20_4_ = fVar270 * local_9c0._20_4_;
    fVar271 = local_280._24_4_;
    auVar17._24_4_ = fVar271 * local_9c0._24_4_;
    auVar17._28_4_ = local_700._28_4_;
    auVar272 = vfmsub231ps_fma(auVar17,local_900,local_2a0);
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar272._12_4_ * auVar272._12_4_,
                                                 CONCAT48(auVar272._8_4_ * auVar272._8_4_,
                                                          CONCAT44(auVar272._4_4_ * auVar272._4_4_,
                                                                   auVar272._0_4_ * auVar272._0_4_))
                                                )),ZEXT1632(auVar89),ZEXT1632(auVar89));
    fVar220 = local_2a0._0_4_;
    auVar226._0_4_ = fVar220 * fVar112;
    fVar232 = local_2a0._4_4_;
    auVar226._4_4_ = fVar232 * fVar206;
    fVar241 = local_2a0._8_4_;
    auVar226._8_4_ = fVar241 * fVar215;
    fVar242 = local_2a0._12_4_;
    auVar226._12_4_ = fVar242 * fVar216;
    fVar281 = local_2a0._16_4_;
    auVar226._16_4_ = fVar281 * fVar217;
    fVar282 = local_2a0._20_4_;
    auVar226._20_4_ = fVar282 * fVar218;
    fVar283 = local_2a0._24_4_;
    auVar226._24_4_ = fVar283 * fVar219;
    auVar226._28_4_ = 0;
    auVar272 = vfmsub231ps_fma(auVar226,local_9c0,local_260);
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar272),ZEXT1632(auVar272));
    auVar227._0_4_ = fVar181 * fVar181;
    auVar227._4_4_ = fVar182 * fVar182;
    auVar227._8_4_ = fVar183 * fVar183;
    auVar227._12_4_ = fVar184 * fVar184;
    auVar227._16_4_ = fVar243 * fVar243;
    auVar227._20_4_ = fVar167 * fVar167;
    auVar227._24_4_ = fVar258 * fVar258;
    auVar227._28_4_ = 0;
    auVar89 = vfmadd231ps_fma(auVar227,local_2a0,local_2a0);
    auVar251 = vfmadd231ps_fma(ZEXT1632(auVar89),local_280,local_280);
    auVar98 = vrcpps_avx(ZEXT1632(auVar251));
    auVar192._8_4_ = 0x3f800000;
    auVar192._0_8_ = 0x3f8000003f800000;
    auVar192._12_4_ = 0x3f800000;
    auVar192._16_4_ = 0x3f800000;
    auVar192._20_4_ = 0x3f800000;
    auVar192._24_4_ = 0x3f800000;
    auVar192._28_4_ = 0x3f800000;
    auVar89 = vfnmadd213ps_fma(auVar98,ZEXT1632(auVar251),auVar192);
    auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar98,auVar98);
    local_9e0 = vpermps_avx2(_DAT_01fb7720,local_900);
    local_a00 = vpermps_avx2(_DAT_01fb7720,local_720);
    auVar18._4_4_ = fVar182 * local_9e0._4_4_;
    auVar18._0_4_ = fVar181 * local_9e0._0_4_;
    auVar18._8_4_ = fVar183 * local_9e0._8_4_;
    auVar18._12_4_ = fVar184 * local_9e0._12_4_;
    auVar18._16_4_ = fVar243 * local_9e0._16_4_;
    auVar18._20_4_ = fVar167 * local_9e0._20_4_;
    auVar18._24_4_ = fVar258 * local_9e0._24_4_;
    auVar18._28_4_ = auVar98._28_4_;
    auVar223 = vfmsub231ps_fma(auVar18,local_a00,local_280);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_9c0);
    auVar19._4_4_ = fVar263 * local_a20._4_4_;
    auVar19._0_4_ = fVar262 * local_a20._0_4_;
    auVar19._8_4_ = fVar264 * local_a20._8_4_;
    auVar19._12_4_ = fVar268 * local_a20._12_4_;
    auVar19._16_4_ = fVar269 * local_a20._16_4_;
    auVar19._20_4_ = fVar270 * local_a20._20_4_;
    auVar19._24_4_ = fVar271 * local_a20._24_4_;
    auVar19._28_4_ = 0;
    auVar13 = local_9e0;
    auVar85 = vfmsub231ps_fma(auVar19,local_9e0,local_2a0);
    auVar223 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar85._12_4_ * auVar85._12_4_,
                                                  CONCAT48(auVar85._8_4_ * auVar85._8_4_,
                                                           CONCAT44(auVar85._4_4_ * auVar85._4_4_,
                                                                    auVar85._0_4_ * auVar85._0_4_)))
                                       ),ZEXT1632(auVar223),ZEXT1632(auVar223));
    auVar12 = local_a00;
    auVar234._0_4_ = fVar220 * local_a00._0_4_;
    auVar234._4_4_ = fVar232 * local_a00._4_4_;
    auVar234._8_4_ = fVar241 * local_a00._8_4_;
    auVar234._12_4_ = fVar242 * local_a00._12_4_;
    auVar234._16_4_ = fVar281 * local_a00._16_4_;
    auVar234._20_4_ = fVar282 * local_a00._20_4_;
    auVar234._24_4_ = fVar283 * local_a00._24_4_;
    auVar234._28_4_ = 0;
    auVar85 = vfmsub231ps_fma(auVar234,local_a20,local_260);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),ZEXT1632(auVar85),ZEXT1632(auVar85));
    auVar98 = vmaxps_avx(ZEXT1632(CONCAT412(auVar89._12_4_ * auVar272._12_4_,
                                            CONCAT48(auVar89._8_4_ * auVar272._8_4_,
                                                     CONCAT44(auVar89._4_4_ * auVar272._4_4_,
                                                              auVar89._0_4_ * auVar272._0_4_)))),
                         ZEXT1632(CONCAT412(auVar223._12_4_ * auVar89._12_4_,
                                            CONCAT48(auVar223._8_4_ * auVar89._8_4_,
                                                     CONCAT44(auVar223._4_4_ * auVar89._4_4_,
                                                              auVar223._0_4_ * auVar89._0_4_)))));
    local_760._0_4_ = auVar8._0_4_ + fVar185;
    local_760._4_4_ = auVar8._4_4_ + fVar200;
    local_760._8_4_ = auVar8._8_4_ + fVar201;
    local_760._12_4_ = auVar8._12_4_ + fVar202;
    local_760._16_4_ = fVar151 * 0.0 + 0.0;
    local_760._20_4_ = fVar151 * 0.0 + 0.0;
    local_760._24_4_ = fVar151 * 0.0 + 0.0;
    local_760._28_4_ = fVar151 + 0.0;
    local_7c0 = ZEXT1632(auVar8);
    auVar194 = vsubps_avx(local_7c0,auVar15);
    local_780 = vpermps_avx2(_DAT_01fb7720,auVar194);
    _local_7a0 = vpermps_avx2(_DAT_01fb7720,local_7c0);
    auVar194 = vmaxps_avx(local_7c0,local_760);
    auVar266 = vmaxps_avx(local_780,_local_7a0);
    auVar238 = vmaxps_avx(auVar194,auVar266);
    auVar194 = vrsqrtps_avx(ZEXT1632(auVar251));
    fVar185 = auVar194._0_4_;
    fVar200 = auVar194._4_4_;
    fVar201 = auVar194._8_4_;
    fVar202 = auVar194._12_4_;
    fVar203 = auVar194._16_4_;
    fVar204 = auVar194._20_4_;
    fVar205 = auVar194._24_4_;
    auVar210._0_4_ = fVar185 * fVar185 * fVar185 * auVar251._0_4_ * -0.5;
    auVar210._4_4_ = fVar200 * fVar200 * fVar200 * auVar251._4_4_ * -0.5;
    auVar210._8_4_ = fVar201 * fVar201 * fVar201 * auVar251._8_4_ * -0.5;
    auVar210._12_4_ = fVar202 * fVar202 * fVar202 * auVar251._12_4_ * -0.5;
    auVar210._16_4_ = fVar203 * fVar203 * fVar203 * -0.0;
    auVar210._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
    auVar210._24_4_ = fVar205 * fVar205 * fVar205 * -0.0;
    auVar210._28_4_ = 0;
    auVar193._8_4_ = 0x3fc00000;
    auVar193._0_8_ = 0x3fc000003fc00000;
    auVar193._12_4_ = 0x3fc00000;
    auVar193._16_4_ = 0x3fc00000;
    auVar193._20_4_ = 0x3fc00000;
    auVar193._24_4_ = 0x3fc00000;
    auVar193._28_4_ = 0x3fc00000;
    auVar89 = vfmadd231ps_fma(auVar210,auVar193,auVar194);
    fVar185 = auVar89._0_4_;
    fVar201 = auVar89._4_4_;
    auVar20._4_4_ = fVar232 * fVar201;
    auVar20._0_4_ = fVar220 * fVar185;
    fVar203 = auVar89._8_4_;
    auVar20._8_4_ = fVar241 * fVar203;
    fVar205 = auVar89._12_4_;
    auVar20._12_4_ = fVar242 * fVar205;
    auVar20._16_4_ = fVar281 * 0.0;
    auVar20._20_4_ = fVar282 * 0.0;
    auVar20._24_4_ = fVar283 * 0.0;
    auVar20._28_4_ = 0;
    auVar21._4_4_ = fStack_67c * fVar182 * fVar201;
    auVar21._0_4_ = local_680 * fVar181 * fVar185;
    auVar21._8_4_ = fStack_678 * fVar183 * fVar203;
    auVar21._12_4_ = fStack_674 * fVar184 * fVar205;
    auVar21._16_4_ = fStack_670 * fVar243 * 0.0;
    auVar21._20_4_ = fStack_66c * fVar167 * 0.0;
    auVar21._24_4_ = fStack_668 * fVar258 * 0.0;
    auVar21._28_4_ = local_260._28_4_;
    auVar272 = vfmadd231ps_fma(auVar21,auVar20,_local_5c0);
    auVar194 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar165 = vsubps_avx(auVar194,auVar273);
    fVar151 = auVar165._0_4_;
    fVar220 = auVar165._4_4_;
    auVar22._4_4_ = fVar220 * fVar182 * fVar201;
    auVar22._0_4_ = fVar151 * fVar181 * fVar185;
    fVar232 = auVar165._8_4_;
    auVar22._8_4_ = fVar232 * fVar183 * fVar203;
    fVar241 = auVar165._12_4_;
    auVar22._12_4_ = fVar241 * fVar184 * fVar205;
    fVar242 = auVar165._16_4_;
    auVar22._16_4_ = fVar242 * fVar243 * 0.0;
    fVar243 = auVar165._20_4_;
    auVar22._20_4_ = fVar243 * fVar167 * 0.0;
    fVar167 = auVar165._24_4_;
    auVar22._24_4_ = fVar167 * fVar258 * 0.0;
    auVar22._28_4_ = local_a20._28_4_;
    auVar266 = vsubps_avx(auVar194,local_620);
    auVar251 = vfmadd231ps_fma(auVar22,auVar266,auVar20);
    auVar23._4_4_ = fVar263 * fVar201;
    auVar23._0_4_ = fVar262 * fVar185;
    auVar23._8_4_ = fVar264 * fVar203;
    auVar23._12_4_ = fVar268 * fVar205;
    auVar23._16_4_ = fVar269 * 0.0;
    auVar23._20_4_ = fVar270 * 0.0;
    auVar23._24_4_ = fVar271 * 0.0;
    auVar23._28_4_ = 0;
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar23,_local_660);
    auVar177 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar194 = vsubps_avx(auVar177,local_a40);
    auVar251 = vfmadd231ps_fma(ZEXT1632(auVar251),auVar194,auVar23);
    _local_7e0 = vsqrtps_avx(auVar98);
    auVar24._4_4_ = fStack_67c * fVar220;
    auVar24._0_4_ = local_680 * fVar151;
    auVar24._8_4_ = fStack_678 * fVar232;
    auVar24._12_4_ = fStack_674 * fVar241;
    auVar24._16_4_ = fStack_670 * fVar242;
    auVar24._20_4_ = fStack_66c * fVar243;
    auVar24._24_4_ = fStack_668 * fVar167;
    auVar24._28_4_ = auVar98._28_4_;
    auVar8 = vfmadd231ps_fma(auVar24,_local_5c0,auVar266);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_660,auVar194);
    fVar200 = auVar251._0_4_;
    fVar258 = auVar272._0_4_;
    fVar202 = auVar251._4_4_;
    fVar262 = auVar272._4_4_;
    fVar204 = auVar251._8_4_;
    fVar263 = auVar272._8_4_;
    fVar181 = auVar251._12_4_;
    fVar264 = auVar272._12_4_;
    auVar98 = vsubps_avx(ZEXT1632(auVar8),
                         ZEXT1632(CONCAT412(fVar264 * fVar181,
                                            CONCAT48(fVar263 * fVar204,
                                                     CONCAT44(fVar262 * fVar202,fVar258 * fVar200)))
                                 ));
    auVar25._4_4_ = fVar220 * fVar220;
    auVar25._0_4_ = fVar151 * fVar151;
    auVar25._8_4_ = fVar232 * fVar232;
    auVar25._12_4_ = fVar241 * fVar241;
    auVar25._16_4_ = fVar242 * fVar242;
    auVar25._20_4_ = fVar243 * fVar243;
    auVar25._24_4_ = fVar167 * fVar167;
    auVar25._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(auVar25,auVar266,auVar266);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar194,auVar194);
    local_840 = vsubps_avx(ZEXT1632(auVar8),
                           ZEXT1632(CONCAT412(fVar181 * fVar181,
                                              CONCAT48(fVar204 * fVar204,
                                                       CONCAT44(fVar202 * fVar202,fVar200 * fVar200)
                                                      ))));
    fVar200 = (local_7e0._0_4_ + auVar238._0_4_) * 1.0000002;
    fVar202 = (local_7e0._4_4_ + auVar238._4_4_) * 1.0000002;
    fVar204 = (local_7e0._8_4_ + auVar238._8_4_) * 1.0000002;
    fVar181 = (local_7e0._12_4_ + auVar238._12_4_) * 1.0000002;
    fVar182 = (local_7e0._16_4_ + auVar238._16_4_) * 1.0000002;
    fVar183 = (local_7e0._20_4_ + auVar238._20_4_) * 1.0000002;
    fVar184 = (local_7e0._24_4_ + auVar238._24_4_) * 1.0000002;
    auVar26._4_4_ = fVar202 * fVar202;
    auVar26._0_4_ = fVar200 * fVar200;
    auVar26._8_4_ = fVar204 * fVar204;
    auVar26._12_4_ = fVar181 * fVar181;
    auVar26._16_4_ = fVar182 * fVar182;
    auVar26._20_4_ = fVar183 * fVar183;
    auVar26._24_4_ = fVar184 * fVar184;
    auVar26._28_4_ = local_7e0._28_4_ + auVar238._28_4_;
    local_2c0._0_4_ = auVar98._0_4_ + auVar98._0_4_;
    local_2c0._4_4_ = auVar98._4_4_ + auVar98._4_4_;
    local_2c0._8_4_ = auVar98._8_4_ + auVar98._8_4_;
    local_2c0._12_4_ = auVar98._12_4_ + auVar98._12_4_;
    local_2c0._16_4_ = auVar98._16_4_ + auVar98._16_4_;
    local_2c0._20_4_ = auVar98._20_4_ + auVar98._20_4_;
    local_2c0._24_4_ = auVar98._24_4_ + auVar98._24_4_;
    local_2c0._28_4_ = auVar98._28_4_ + auVar98._28_4_;
    auVar238 = vsubps_avx(local_840,auVar26);
    auVar260 = ZEXT1632(auVar272);
    auVar142 = ZEXT1632(CONCAT412(fVar264 * fVar264,
                                  CONCAT48(fVar263 * fVar263,
                                           CONCAT44(fVar262 * fVar262,fVar258 * fVar258))));
    local_920 = vsubps_avx(local_220,auVar142);
    local_5e0._4_4_ = local_2c0._4_4_ * local_2c0._4_4_;
    local_5e0._0_4_ = local_2c0._0_4_ * local_2c0._0_4_;
    local_5e0._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    local_5e0._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    local_5e0._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    local_5e0._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    local_5e0._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    local_5e0._28_4_ = local_7e0._28_4_;
    fVar200 = local_920._0_4_;
    local_600._0_4_ = fVar200 * 4.0;
    fVar202 = local_920._4_4_;
    local_600._4_4_ = fVar202 * 4.0;
    fVar204 = local_920._8_4_;
    fStack_5f8 = fVar204 * 4.0;
    fVar181 = local_920._12_4_;
    fStack_5f4 = fVar181 * 4.0;
    fVar182 = local_920._16_4_;
    fStack_5f0 = fVar182 * 4.0;
    fVar183 = local_920._20_4_;
    fStack_5ec = fVar183 * 4.0;
    fVar184 = local_920._24_4_;
    fStack_5e8 = fVar184 * 4.0;
    uStack_5e4 = 0x40800000;
    auVar27._4_4_ = auVar238._4_4_ * (float)local_600._4_4_;
    auVar27._0_4_ = auVar238._0_4_ * (float)local_600._0_4_;
    auVar27._8_4_ = auVar238._8_4_ * fStack_5f8;
    auVar27._12_4_ = auVar238._12_4_ * fStack_5f4;
    auVar27._16_4_ = auVar238._16_4_ * fStack_5f0;
    auVar27._20_4_ = auVar238._20_4_ * fStack_5ec;
    auVar27._24_4_ = auVar238._24_4_ * fStack_5e8;
    auVar27._28_4_ = 0x40800000;
    auVar127 = vsubps_avx(local_5e0,auVar27);
    auVar240 = ZEXT3264(auVar127);
    auVar98 = vcmpps_avx(auVar127,auVar177,5);
    local_2e0._0_4_ = fVar200 + fVar200;
    local_2e0._4_4_ = fVar202 + fVar202;
    local_2e0._8_4_ = fVar204 + fVar204;
    local_2e0._12_4_ = fVar181 + fVar181;
    local_2e0._16_4_ = fVar182 + fVar182;
    local_2e0._20_4_ = fVar183 + fVar183;
    local_2e0._24_4_ = fVar184 + fVar184;
    local_2e0._28_4_ = local_920._28_4_ + local_920._28_4_;
    auVar285 = ZEXT1632(auVar251);
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0x7f,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar98 >> 0xbf,0) == '\0') &&
        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f]) {
      auVar195._8_4_ = 0x7f800000;
      auVar195._0_8_ = 0x7f8000007f800000;
      auVar195._12_4_ = 0x7f800000;
      auVar195._16_4_ = 0x7f800000;
      auVar195._20_4_ = 0x7f800000;
      auVar195._24_4_ = 0x7f800000;
      auVar195._28_4_ = 0x7f800000;
      auVar256 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      local_a60 = auVar98;
      auVar9 = vsqrtps_avx(auVar127);
      auVar177 = vcmpps_avx(auVar127,auVar177,5);
      auVar240 = ZEXT3264(auVar177);
      auVar127 = vrcpps_avx(local_2e0);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar124._16_4_ = 0x3f800000;
      auVar124._20_4_ = 0x3f800000;
      auVar124._24_4_ = 0x3f800000;
      auVar124._28_4_ = 0x3f800000;
      auVar272 = vfnmadd213ps_fma(auVar127,local_2e0,auVar124);
      auVar272 = vfmadd132ps_fma(ZEXT1632(auVar272),auVar127,auVar127);
      uVar76 = CONCAT44(local_2c0._4_4_,local_2c0._0_4_);
      auVar196._0_8_ = uVar76 ^ 0x8000000080000000;
      auVar196._8_4_ = -local_2c0._8_4_;
      auVar196._12_4_ = -local_2c0._12_4_;
      auVar196._16_4_ = -local_2c0._16_4_;
      auVar196._20_4_ = -local_2c0._20_4_;
      auVar196._24_4_ = -local_2c0._24_4_;
      auVar196._28_4_ = -local_2c0._28_4_;
      auVar127 = vsubps_avx(auVar196,auVar9);
      auVar28._4_4_ = auVar272._4_4_ * auVar127._4_4_;
      auVar28._0_4_ = auVar272._0_4_ * auVar127._0_4_;
      auVar28._8_4_ = auVar272._8_4_ * auVar127._8_4_;
      auVar28._12_4_ = auVar272._12_4_ * auVar127._12_4_;
      auVar28._16_4_ = auVar127._16_4_ * 0.0;
      auVar28._20_4_ = auVar127._20_4_ * 0.0;
      auVar28._24_4_ = auVar127._24_4_ * 0.0;
      auVar28._28_4_ = auVar127._28_4_;
      auVar127 = vsubps_avx(auVar9,local_2c0);
      auVar278._0_4_ = auVar127._0_4_ * auVar272._0_4_;
      auVar278._4_4_ = auVar127._4_4_ * auVar272._4_4_;
      auVar278._8_4_ = auVar127._8_4_ * auVar272._8_4_;
      auVar278._12_4_ = auVar127._12_4_ * auVar272._12_4_;
      auVar278._16_4_ = auVar127._16_4_ * 0.0;
      auVar278._20_4_ = auVar127._20_4_ * 0.0;
      auVar278._24_4_ = auVar127._24_4_ * 0.0;
      auVar278._28_4_ = 0;
      auVar272 = vfmadd213ps_fma(auVar260,auVar28,auVar285);
      local_320 = auVar272._0_4_ * fVar185;
      fStack_31c = auVar272._4_4_ * fVar201;
      fStack_318 = auVar272._8_4_ * fVar203;
      fStack_314 = auVar272._12_4_ * fVar205;
      uStack_310 = 0;
      uStack_30c = 0;
      uStack_308 = 0;
      uStack_304 = 0x80000000;
      local_6e0 = auVar142;
      auVar127 = vandps_avx(auVar142,local_6c0);
      auVar127 = vmaxps_avx(local_500,auVar127);
      auVar29._4_4_ = auVar127._4_4_ * 1.9073486e-06;
      auVar29._0_4_ = auVar127._0_4_ * 1.9073486e-06;
      auVar29._8_4_ = auVar127._8_4_ * 1.9073486e-06;
      auVar29._12_4_ = auVar127._12_4_ * 1.9073486e-06;
      auVar29._16_4_ = auVar127._16_4_ * 1.9073486e-06;
      auVar29._20_4_ = auVar127._20_4_ * 1.9073486e-06;
      auVar29._24_4_ = auVar127._24_4_ * 1.9073486e-06;
      auVar29._28_4_ = auVar127._28_4_;
      auVar127 = vandps_avx(local_920,local_6c0);
      auVar9 = vcmpps_avx(auVar127,auVar29,1);
      auVar272 = vfmadd213ps_fma(auVar260,auVar278,auVar285);
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar100._16_4_ = 0x7f800000;
      auVar100._20_4_ = 0x7f800000;
      auVar100._24_4_ = 0x7f800000;
      auVar100._28_4_ = 0x7f800000;
      auVar195 = vblendvps_avx(auVar100,auVar28,auVar177);
      local_340 = fVar185 * auVar272._0_4_;
      fStack_33c = fVar201 * auVar272._4_4_;
      fStack_338 = fVar203 * auVar272._8_4_;
      fStack_334 = fVar205 * auVar272._12_4_;
      uStack_330 = 0;
      uStack_32c = 0;
      uStack_328 = 0;
      uStack_324 = 0x7f800000;
      auVar175._8_4_ = 0xff800000;
      auVar175._0_8_ = 0xff800000ff800000;
      auVar175._12_4_ = 0xff800000;
      auVar175._16_4_ = 0xff800000;
      auVar175._20_4_ = 0xff800000;
      auVar175._24_4_ = 0xff800000;
      auVar175._28_4_ = 0xff800000;
      auVar127 = vblendvps_avx(auVar175,auVar278,auVar177);
      auVar256 = ZEXT3264(auVar127);
      auVar10 = auVar177 & auVar9;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar98 = vandps_avx(auVar9,auVar177);
        auVar9 = vcmpps_avx(auVar238,_DAT_01f7b000,2);
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar111._8_4_ = 0x7f800000;
        auVar111._0_8_ = 0x7f8000007f800000;
        auVar111._12_4_ = 0x7f800000;
        auVar111._16_4_ = 0x7f800000;
        auVar111._20_4_ = 0x7f800000;
        auVar111._24_4_ = 0x7f800000;
        auVar111._28_4_ = 0x7f800000;
        auVar238 = vblendvps_avx(auVar111,auVar150,auVar9);
        auVar272 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar272);
        auVar195 = vblendvps_avx(auVar195,auVar238,auVar10);
        auVar238 = vblendvps_avx(auVar150,auVar111,auVar9);
        auVar238 = vblendvps_avx(auVar127,auVar238,auVar10);
        auVar256 = ZEXT3264(auVar238);
        auVar180._0_8_ = auVar98._0_8_ ^ 0xffffffffffffffff;
        auVar180._8_4_ = auVar98._8_4_ ^ 0xffffffff;
        auVar180._12_4_ = auVar98._12_4_ ^ 0xffffffff;
        auVar180._16_4_ = auVar98._16_4_ ^ 0xffffffff;
        auVar180._20_4_ = auVar98._20_4_ ^ 0xffffffff;
        auVar180._24_4_ = auVar98._24_4_ ^ 0xffffffff;
        auVar180._28_4_ = auVar98._28_4_ ^ 0xffffffff;
        auVar98 = vorps_avx(auVar9,auVar180);
        auVar98 = vandps_avx(auVar177,auVar98);
      }
    }
    auVar279 = ZEXT3264(local_300);
    auVar238 = local_300 & auVar98;
    local_840._0_8_ = uVar75;
    if ((((((((auVar238 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar238 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar238 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar238 >> 0x7f,0) == '\0') &&
          (auVar238 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar238 >> 0xbf,0) == '\0') &&
        (auVar238 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar238[0x1f])
    {
LAB_01163439:
      auVar267 = ZEXT3264(auVar194);
      auVar230 = ZEXT3264(auVar266);
      auVar214 = ZEXT3264(local_800);
    }
    else {
      local_8a0 = ZEXT1632(auVar89);
      fVar200 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_820._0_4_;
      auVar176._4_4_ = fVar200;
      auVar176._0_4_ = fVar200;
      auVar176._8_4_ = fVar200;
      auVar176._12_4_ = fVar200;
      auVar176._16_4_ = fVar200;
      auVar176._20_4_ = fVar200;
      auVar176._24_4_ = fVar200;
      auVar176._28_4_ = fVar200;
      auVar238 = vmaxps_avx(auVar176,auVar195);
      fVar200 = (ray->super_RayK<1>).tfar - (float)local_820._0_4_;
      auVar197._4_4_ = fVar200;
      auVar197._0_4_ = fVar200;
      auVar197._8_4_ = fVar200;
      auVar197._12_4_ = fVar200;
      auVar197._16_4_ = fVar200;
      auVar197._20_4_ = fVar200;
      auVar197._24_4_ = fVar200;
      auVar197._28_4_ = fVar200;
      auVar127 = vminps_avx(auVar197,auVar256._0_32_);
      auVar30._4_4_ = fVar220 * fVar206;
      auVar30._0_4_ = fVar151 * fVar112;
      auVar30._8_4_ = fVar232 * fVar215;
      auVar30._12_4_ = fVar241 * fVar216;
      auVar30._16_4_ = fVar242 * fVar217;
      auVar30._20_4_ = fVar243 * fVar218;
      auVar30._24_4_ = fVar167 * fVar219;
      auVar30._28_4_ = auVar165._28_4_;
      auVar89 = vfmadd213ps_fma(auVar266,local_9c0,auVar30);
      auVar272 = vfmadd213ps_fma(auVar194,local_900,ZEXT1632(auVar89));
      auVar31._4_4_ = fVar206 * fStack_67c;
      auVar31._0_4_ = fVar112 * local_680;
      auVar31._8_4_ = fVar215 * fStack_678;
      auVar31._12_4_ = fVar216 * fStack_674;
      auVar31._16_4_ = fVar217 * fStack_670;
      auVar31._20_4_ = fVar218 * fStack_66c;
      auVar31._24_4_ = fVar219 * fStack_668;
      auVar31._28_4_ = auVar165._28_4_;
      auVar89 = vfmadd231ps_fma(auVar31,_local_5c0,local_9c0);
      auVar251 = vfmadd231ps_fma(ZEXT1632(auVar89),local_900,_local_660);
      auVar256 = ZEXT3264(local_6c0);
      auVar194 = vandps_avx(local_6c0,ZEXT1632(auVar251));
      auVar101._8_4_ = 0x219392ef;
      auVar101._0_8_ = 0x219392ef219392ef;
      auVar101._12_4_ = 0x219392ef;
      auVar101._16_4_ = 0x219392ef;
      auVar101._20_4_ = 0x219392ef;
      auVar101._24_4_ = 0x219392ef;
      auVar101._28_4_ = 0x219392ef;
      auVar266 = vcmpps_avx(auVar194,auVar101,1);
      auVar194 = vrcpps_avx(ZEXT1632(auVar251));
      local_a60 = auVar98;
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar165 = ZEXT1632(auVar251);
      auVar89 = vfnmadd213ps_fma(auVar194,auVar165,auVar102);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar194,auVar194);
      auVar274._0_8_ = auVar251._0_8_ ^ 0x8000000080000000;
      auVar274._8_4_ = auVar251._8_4_ ^ 0x80000000;
      auVar274._12_4_ = auVar251._12_4_ ^ 0x80000000;
      auVar274._16_4_ = 0x80000000;
      auVar274._20_4_ = 0x80000000;
      auVar274._24_4_ = 0x80000000;
      auVar274._28_4_ = 0x80000000;
      auVar32._4_4_ = auVar89._4_4_ * -auVar272._4_4_;
      auVar32._0_4_ = auVar89._0_4_ * -auVar272._0_4_;
      auVar32._8_4_ = auVar89._8_4_ * -auVar272._8_4_;
      auVar32._12_4_ = auVar89._12_4_ * -auVar272._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar194 = vcmpps_avx(auVar165,auVar274,1);
      auVar194 = vorps_avx(auVar266,auVar194);
      auVar265._8_4_ = 0xff800000;
      auVar265._0_8_ = 0xff800000ff800000;
      auVar265._12_4_ = 0xff800000;
      auVar265._16_4_ = 0xff800000;
      auVar265._20_4_ = 0xff800000;
      auVar265._24_4_ = 0xff800000;
      auVar265._28_4_ = 0xff800000;
      auVar194 = vblendvps_avx(auVar32,auVar265,auVar194);
      auVar238 = vmaxps_avx(auVar238,auVar194);
      auVar194 = vcmpps_avx(auVar165,auVar274,6);
      auVar194 = vorps_avx(auVar266,auVar194);
      auVar275._8_4_ = 0x7f800000;
      auVar275._0_8_ = 0x7f8000007f800000;
      auVar275._12_4_ = 0x7f800000;
      auVar275._16_4_ = 0x7f800000;
      auVar275._20_4_ = 0x7f800000;
      auVar275._24_4_ = 0x7f800000;
      auVar275._28_4_ = 0x7f800000;
      auVar194 = vblendvps_avx(auVar32,auVar275,auVar194);
      auVar165 = vminps_avx(auVar127,auVar194);
      fVar200 = -local_a00._0_4_;
      fVar202 = -local_a00._4_4_;
      fVar204 = -local_a00._8_4_;
      fVar181 = -local_a00._12_4_;
      fVar182 = -local_a00._16_4_;
      fVar183 = -local_a00._20_4_;
      fVar184 = -local_a00._24_4_;
      auVar228._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
      auVar228._8_4_ = -local_a20._8_4_;
      auVar228._12_4_ = -local_a20._12_4_;
      auVar228._16_4_ = -local_a20._16_4_;
      auVar228._20_4_ = -local_a20._20_4_;
      auVar228._24_4_ = -local_a20._24_4_;
      auVar228._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar266 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar194 = vsubps_avx(auVar266,local_700);
      auVar266 = vsubps_avx(auVar266,local_9a0);
      auVar33._4_4_ = auVar266._4_4_ * fVar202;
      auVar33._0_4_ = auVar266._0_4_ * fVar200;
      auVar33._8_4_ = auVar266._8_4_ * fVar204;
      auVar33._12_4_ = auVar266._12_4_ * fVar181;
      auVar33._16_4_ = auVar266._16_4_ * fVar182;
      auVar33._20_4_ = auVar266._20_4_ * fVar183;
      auVar33._24_4_ = auVar266._24_4_ * fVar184;
      auVar33._28_4_ = auVar266._28_4_;
      auVar89 = vfmadd231ps_fma(auVar33,auVar228,auVar194);
      auVar235._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
      auVar235._8_4_ = -local_9e0._8_4_;
      auVar235._12_4_ = -local_9e0._12_4_;
      auVar235._16_4_ = -local_9e0._16_4_;
      auVar235._20_4_ = -local_9e0._20_4_;
      auVar235._24_4_ = -local_9e0._24_4_;
      auVar235._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar194 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,_local_860);
      auVar272 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar235,auVar194);
      auVar34._4_4_ = fVar202 * fStack_67c;
      auVar34._0_4_ = fVar200 * local_680;
      auVar34._8_4_ = fVar204 * fStack_678;
      auVar34._12_4_ = fVar181 * fStack_674;
      auVar34._16_4_ = fVar182 * fStack_670;
      auVar34._20_4_ = fVar183 * fStack_66c;
      auVar34._24_4_ = fVar184 * fStack_668;
      auVar34._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar89 = vfmadd231ps_fma(auVar34,_local_5c0,auVar228);
      auVar251 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar235,_local_660);
      auVar194 = vandps_avx(local_6c0,ZEXT1632(auVar251));
      auVar127 = vrcpps_avx(ZEXT1632(auVar251));
      auVar211._8_4_ = 0x219392ef;
      auVar211._0_8_ = 0x219392ef219392ef;
      auVar211._12_4_ = 0x219392ef;
      auVar211._16_4_ = 0x219392ef;
      auVar211._20_4_ = 0x219392ef;
      auVar211._24_4_ = 0x219392ef;
      auVar211._28_4_ = 0x219392ef;
      auVar266 = vcmpps_avx(auVar194,auVar211,1);
      auVar177 = ZEXT1632(auVar251);
      auVar89 = vfnmadd213ps_fma(auVar127,auVar177,auVar102);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar127,auVar127);
      auVar236._0_8_ = auVar251._0_8_ ^ 0x8000000080000000;
      auVar236._8_4_ = auVar251._8_4_ ^ 0x80000000;
      auVar236._12_4_ = auVar251._12_4_ ^ 0x80000000;
      auVar236._16_4_ = 0x80000000;
      auVar236._20_4_ = 0x80000000;
      auVar236._24_4_ = 0x80000000;
      auVar236._28_4_ = 0x80000000;
      auVar240 = ZEXT3264(auVar236);
      auVar35._4_4_ = auVar89._4_4_ * -auVar272._4_4_;
      auVar35._0_4_ = auVar89._0_4_ * -auVar272._0_4_;
      auVar35._8_4_ = auVar89._8_4_ * -auVar272._8_4_;
      auVar35._12_4_ = auVar89._12_4_ * -auVar272._12_4_;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar194 = vcmpps_avx(auVar177,auVar236,1);
      auVar194 = vorps_avx(auVar194,auVar266);
      auVar103._8_4_ = 0xff800000;
      auVar103._0_8_ = 0xff800000ff800000;
      auVar103._12_4_ = 0xff800000;
      auVar103._16_4_ = 0xff800000;
      auVar103._20_4_ = 0xff800000;
      auVar103._24_4_ = 0xff800000;
      auVar103._28_4_ = 0xff800000;
      auVar194 = vblendvps_avx(auVar35,auVar103,auVar194);
      local_6a0 = vmaxps_avx(auVar238,auVar194);
      auVar238 = vcmpps_avx(auVar177,auVar236,6);
      auVar238 = vorps_avx(auVar266,auVar238);
      auVar238 = vblendvps_avx(auVar35,auVar275,auVar238);
      auVar98 = vandps_avx(local_300,auVar98);
      local_560 = vminps_avx(auVar165,auVar238);
      auVar238 = vcmpps_avx(local_6a0,local_560,2);
      auVar165 = auVar98 & auVar238;
      if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar165 >> 0x7f,0) == '\0') &&
            (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar165 >> 0xbf,0) == '\0') &&
          (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar165[0x1f]) goto LAB_01163439;
      auVar66._4_4_ = fStack_31c;
      auVar66._0_4_ = local_320;
      auVar66._8_4_ = fStack_318;
      auVar66._12_4_ = fStack_314;
      auVar66._16_4_ = uStack_310;
      auVar66._20_4_ = uStack_30c;
      auVar66._24_4_ = uStack_308;
      auVar66._28_4_ = uStack_304;
      auVar212._8_4_ = 0x3f800000;
      auVar212._0_8_ = 0x3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      auVar212._16_4_ = 0x3f800000;
      auVar212._20_4_ = 0x3f800000;
      auVar212._24_4_ = 0x3f800000;
      auVar212._28_4_ = 0x3f800000;
      auVar194 = vminps_avx(auVar66,auVar212);
      auVar267 = ZEXT864(0) << 0x20;
      auVar194 = vmaxps_avx(auVar194,ZEXT832(0) << 0x20);
      auVar65._4_4_ = fStack_33c;
      auVar65._0_4_ = local_340;
      auVar65._8_4_ = fStack_338;
      auVar65._12_4_ = fStack_334;
      auVar65._16_4_ = uStack_330;
      auVar65._20_4_ = uStack_32c;
      auVar65._24_4_ = uStack_328;
      auVar65._28_4_ = uStack_324;
      auVar266 = vminps_avx(auVar65,auVar212);
      auVar266 = vmaxps_avx(auVar266,ZEXT832(0) << 0x20);
      auVar36._4_4_ = (auVar194._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar194._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar194._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar194._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar194._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar194._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar194._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar194._28_4_ + 7.0;
      auVar89 = vfmadd213ps_fma(auVar36,local_740,local_880);
      auVar37._4_4_ = (auVar266._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar266._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar266._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar266._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar266._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar266._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar266._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar266._28_4_ + 7.0;
      auVar272 = vfmadd213ps_fma(auVar37,local_740,local_880);
      auVar194 = vminps_avx(local_7c0,local_760);
      auVar266 = vminps_avx(local_780,_local_7a0);
      auVar194 = vminps_avx(auVar194,auVar266);
      auVar194 = vsubps_avx(auVar194,_local_7e0);
      auVar98 = vandps_avx(auVar238,auVar98);
      local_1a0 = ZEXT1632(auVar89);
      local_1c0 = ZEXT1632(auVar272);
      auVar38._4_4_ = auVar194._4_4_ * 0.99999976;
      auVar38._0_4_ = auVar194._0_4_ * 0.99999976;
      auVar38._8_4_ = auVar194._8_4_ * 0.99999976;
      auVar38._12_4_ = auVar194._12_4_ * 0.99999976;
      auVar38._16_4_ = auVar194._16_4_ * 0.99999976;
      auVar38._20_4_ = auVar194._20_4_ * 0.99999976;
      auVar38._24_4_ = auVar194._24_4_ * 0.99999976;
      auVar38._28_4_ = 0x3f7ffffc;
      auVar194 = vmaxps_avx(ZEXT832(0) << 0x20,auVar38);
      auVar39._4_4_ = auVar194._4_4_ * auVar194._4_4_;
      auVar39._0_4_ = auVar194._0_4_ * auVar194._0_4_;
      auVar39._8_4_ = auVar194._8_4_ * auVar194._8_4_;
      auVar39._12_4_ = auVar194._12_4_ * auVar194._12_4_;
      auVar39._16_4_ = auVar194._16_4_ * auVar194._16_4_;
      auVar39._20_4_ = auVar194._20_4_ * auVar194._20_4_;
      auVar39._24_4_ = auVar194._24_4_ * auVar194._24_4_;
      auVar39._28_4_ = auVar194._28_4_;
      auVar266 = vsubps_avx(local_840,auVar39);
      auVar40._4_4_ = auVar266._4_4_ * (float)local_600._4_4_;
      auVar40._0_4_ = auVar266._0_4_ * (float)local_600._0_4_;
      auVar40._8_4_ = auVar266._8_4_ * fStack_5f8;
      auVar40._12_4_ = auVar266._12_4_ * fStack_5f4;
      auVar40._16_4_ = auVar266._16_4_ * fStack_5f0;
      auVar40._20_4_ = auVar266._20_4_ * fStack_5ec;
      auVar40._24_4_ = auVar266._24_4_ * fStack_5e8;
      auVar40._28_4_ = auVar194._28_4_;
      auVar194 = vsubps_avx(local_5e0,auVar40);
      local_a60 = vcmpps_avx(auVar194,ZEXT832(0) << 0x20,5);
      if ((((((((local_a60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_a60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a60 >> 0x7f,0) == '\0') &&
            (local_a60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_a60 >> 0xbf,0) == '\0') &&
          (local_a60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_a60[0x1f]) {
        auVar260 = ZEXT1632(ZEXT816(0) << 0x40);
        auVar240 = ZEXT864(0) << 0x20;
        auVar165 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar127 = ZEXT1632(ZEXT816(0) << 0x40);
        auVar259 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar248._8_4_ = 0x7f800000;
        auVar248._0_8_ = 0x7f8000007f800000;
        auVar248._12_4_ = 0x7f800000;
        auVar248._16_4_ = 0x7f800000;
        auVar248._20_4_ = 0x7f800000;
        auVar248._24_4_ = 0x7f800000;
        auVar248._28_4_ = 0x7f800000;
        auVar254._8_4_ = 0xff800000;
        auVar254._0_8_ = 0xff800000ff800000;
        auVar254._12_4_ = 0xff800000;
        auVar254._16_4_ = 0xff800000;
        auVar254._20_4_ = 0xff800000;
        auVar254._24_4_ = 0xff800000;
        auVar254._28_4_ = 0xff800000;
      }
      else {
        auVar238 = vrcpps_avx(local_2e0);
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = 0x3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar106._16_4_ = 0x3f800000;
        auVar106._20_4_ = 0x3f800000;
        auVar106._24_4_ = 0x3f800000;
        auVar106._28_4_ = 0x3f800000;
        auVar89 = vfnmadd213ps_fma(local_2e0,auVar238,auVar106);
        auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar238,auVar238);
        auVar238 = vsqrtps_avx(auVar194);
        uVar76 = CONCAT44(local_2c0._4_4_,local_2c0._0_4_);
        auVar237._0_8_ = uVar76 ^ 0x8000000080000000;
        auVar237._8_4_ = -local_2c0._8_4_;
        auVar237._12_4_ = -local_2c0._12_4_;
        auVar237._16_4_ = -local_2c0._16_4_;
        auVar237._20_4_ = -local_2c0._20_4_;
        auVar237._24_4_ = -local_2c0._24_4_;
        auVar237._28_4_ = -local_2c0._28_4_;
        auVar165 = vsubps_avx(auVar237,auVar238);
        auVar127 = vsubps_avx(auVar238,local_2c0);
        fVar200 = auVar165._0_4_ * auVar89._0_4_;
        fVar202 = auVar165._4_4_ * auVar89._4_4_;
        auVar41._4_4_ = fVar202;
        auVar41._0_4_ = fVar200;
        fVar204 = auVar165._8_4_ * auVar89._8_4_;
        auVar41._8_4_ = fVar204;
        fVar181 = auVar165._12_4_ * auVar89._12_4_;
        auVar41._12_4_ = fVar181;
        fVar182 = auVar165._16_4_ * 0.0;
        auVar41._16_4_ = fVar182;
        fVar183 = auVar165._20_4_ * 0.0;
        auVar41._20_4_ = fVar183;
        fVar184 = auVar165._24_4_ * 0.0;
        auVar41._24_4_ = fVar184;
        auVar41._28_4_ = auVar238._28_4_;
        auVar198._0_4_ = auVar127._0_4_ * auVar89._0_4_;
        auVar198._4_4_ = auVar127._4_4_ * auVar89._4_4_;
        auVar198._8_4_ = auVar127._8_4_ * auVar89._8_4_;
        auVar198._12_4_ = auVar127._12_4_ * auVar89._12_4_;
        auVar198._16_4_ = auVar127._16_4_ * 0.0;
        auVar198._20_4_ = auVar127._20_4_ * 0.0;
        auVar198._24_4_ = auVar127._24_4_ * 0.0;
        auVar198._28_4_ = 0;
        auVar89 = vfmadd213ps_fma(auVar260,auVar41,auVar285);
        auVar272 = vfmadd213ps_fma(auVar260,auVar198,auVar285);
        auVar238 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar205,
                                      CONCAT48(auVar89._8_4_ * fVar203,
                                               CONCAT44(auVar89._4_4_ * fVar201,
                                                        auVar89._0_4_ * fVar185))));
        auVar42._28_4_ = auVar127._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(auVar272._12_4_ * fVar205,
                                CONCAT48(auVar272._8_4_ * fVar203,
                                         CONCAT44(auVar272._4_4_ * fVar201,auVar272._0_4_ * fVar185)
                                        )));
        auVar89 = vfmadd213ps_fma(local_280,auVar238,local_a40);
        auVar272 = vfmadd213ps_fma(local_280,auVar42,local_a40);
        local_6e0 = auVar142;
        auVar251 = vfmadd213ps_fma(local_2a0,auVar238,local_620);
        auVar8 = vfmadd213ps_fma(local_2a0,auVar42,local_620);
        auVar223 = vfmadd213ps_fma(auVar238,local_260,auVar273);
        auVar85 = vfmadd213ps_fma(local_260,auVar42,auVar273);
        auVar43._4_4_ = (float)local_660._4_4_ * fVar202;
        auVar43._0_4_ = (float)local_660._0_4_ * fVar200;
        auVar43._8_4_ = fStack_658 * fVar204;
        auVar43._12_4_ = fStack_654 * fVar181;
        auVar43._16_4_ = fStack_650 * fVar182;
        auVar43._20_4_ = fStack_64c * fVar183;
        auVar43._24_4_ = fStack_648 * fVar184;
        auVar43._28_4_ = 0;
        auVar165 = vsubps_avx(auVar43,ZEXT1632(auVar89));
        auVar70._4_4_ = (float)local_5c0._4_4_ * fVar202;
        auVar70._0_4_ = (float)local_5c0._0_4_ * fVar200;
        auVar70._8_4_ = fStack_5b8 * fVar204;
        auVar70._12_4_ = fStack_5b4 * fVar181;
        auVar70._16_4_ = fStack_5b0 * fVar182;
        auVar70._20_4_ = fStack_5ac * fVar183;
        auVar70._24_4_ = fStack_5a8 * fVar184;
        auVar70._28_4_ = 0x80000000;
        auVar127 = vsubps_avx(auVar70,ZEXT1632(auVar251));
        auVar144._0_4_ = local_680 * fVar200;
        auVar144._4_4_ = fStack_67c * fVar202;
        auVar144._8_4_ = fStack_678 * fVar204;
        auVar144._12_4_ = fStack_674 * fVar181;
        auVar144._16_4_ = fStack_670 * fVar182;
        auVar144._20_4_ = fStack_66c * fVar183;
        auVar144._24_4_ = fStack_668 * fVar184;
        auVar144._28_4_ = 0;
        auVar177 = vsubps_avx(auVar144,ZEXT1632(auVar223));
        auVar44._4_4_ = (float)local_660._4_4_ * auVar198._4_4_;
        auVar44._0_4_ = (float)local_660._0_4_ * auVar198._0_4_;
        auVar44._8_4_ = fStack_658 * auVar198._8_4_;
        auVar44._12_4_ = fStack_654 * auVar198._12_4_;
        auVar44._16_4_ = fStack_650 * auVar198._16_4_;
        auVar44._20_4_ = fStack_64c * auVar198._20_4_;
        auVar44._24_4_ = fStack_648 * auVar198._24_4_;
        auVar44._28_4_ = auVar177._28_4_;
        auVar238 = vsubps_avx(auVar44,ZEXT1632(auVar272));
        auVar267 = ZEXT3264(auVar238);
        auVar45._4_4_ = (float)local_5c0._4_4_ * auVar198._4_4_;
        auVar45._0_4_ = (float)local_5c0._0_4_ * auVar198._0_4_;
        auVar45._8_4_ = fStack_5b8 * auVar198._8_4_;
        auVar45._12_4_ = fStack_5b4 * auVar198._12_4_;
        auVar45._16_4_ = fStack_5b0 * auVar198._16_4_;
        auVar45._20_4_ = fStack_5ac * auVar198._20_4_;
        auVar45._24_4_ = fStack_5a8 * auVar198._24_4_;
        auVar45._28_4_ = auVar177._28_4_;
        auVar260 = vsubps_avx(auVar45,ZEXT1632(auVar8));
        auVar239._0_4_ = local_680 * auVar198._0_4_;
        auVar239._4_4_ = fStack_67c * auVar198._4_4_;
        auVar239._8_4_ = fStack_678 * auVar198._8_4_;
        auVar239._12_4_ = fStack_674 * auVar198._12_4_;
        auVar239._16_4_ = fStack_670 * auVar198._16_4_;
        auVar239._20_4_ = fStack_66c * auVar198._20_4_;
        auVar239._24_4_ = fStack_668 * auVar198._24_4_;
        auVar239._28_4_ = 0;
        auVar238 = vsubps_avx(auVar239,ZEXT1632(auVar85));
        auVar240 = ZEXT3264(auVar238);
        auVar238 = vcmpps_avx(auVar194,_DAT_01f7b000,5);
        auVar249._8_4_ = 0x7f800000;
        auVar249._0_8_ = 0x7f8000007f800000;
        auVar249._12_4_ = 0x7f800000;
        auVar249._16_4_ = 0x7f800000;
        auVar249._20_4_ = 0x7f800000;
        auVar249._24_4_ = 0x7f800000;
        auVar249._28_4_ = 0x7f800000;
        auVar248 = vblendvps_avx(auVar249,auVar41,auVar238);
        auVar194 = vandps_avx(local_6c0,auVar142);
        auVar194 = vmaxps_avx(local_500,auVar194);
        auVar46._4_4_ = auVar194._4_4_ * 1.9073486e-06;
        auVar46._0_4_ = auVar194._0_4_ * 1.9073486e-06;
        auVar46._8_4_ = auVar194._8_4_ * 1.9073486e-06;
        auVar46._12_4_ = auVar194._12_4_ * 1.9073486e-06;
        auVar46._16_4_ = auVar194._16_4_ * 1.9073486e-06;
        auVar46._20_4_ = auVar194._20_4_ * 1.9073486e-06;
        auVar46._24_4_ = auVar194._24_4_ * 1.9073486e-06;
        auVar46._28_4_ = auVar194._28_4_;
        auVar194 = vandps_avx(local_6c0,local_920);
        auVar194 = vcmpps_avx(auVar194,auVar46,1);
        auVar255._8_4_ = 0xff800000;
        auVar255._0_8_ = 0xff800000ff800000;
        auVar255._12_4_ = 0xff800000;
        auVar255._16_4_ = 0xff800000;
        auVar255._20_4_ = 0xff800000;
        auVar255._24_4_ = 0xff800000;
        auVar255._28_4_ = 0xff800000;
        auVar254 = vblendvps_avx(auVar255,auVar198,auVar238);
        auVar142 = auVar238 & auVar194;
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0x7f,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar142 >> 0xbf,0) != '\0') ||
            (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar142[0x1f] < '\0') {
          auVar194 = vandps_avx(auVar238,auVar194);
          auVar142 = vcmpps_avx(auVar266,ZEXT832(0) << 0x20,2);
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar266 = vblendvps_avx(auVar286,auVar261,auVar142);
          auVar89 = vpackssdw_avx(auVar194._0_16_,auVar194._16_16_);
          auVar273 = vpmovsxwd_avx2(auVar89);
          auVar248 = vblendvps_avx(auVar248,auVar266,auVar273);
          auVar266 = vblendvps_avx(auVar261,auVar286,auVar142);
          auVar254 = vblendvps_avx(auVar254,auVar266,auVar273);
          auVar199._0_8_ = auVar194._0_8_ ^ 0xffffffffffffffff;
          auVar199._8_4_ = auVar194._8_4_ ^ 0xffffffff;
          auVar199._12_4_ = auVar194._12_4_ ^ 0xffffffff;
          auVar199._16_4_ = auVar194._16_4_ ^ 0xffffffff;
          auVar199._20_4_ = auVar194._20_4_ ^ 0xffffffff;
          auVar199._24_4_ = auVar194._24_4_ ^ 0xffffffff;
          auVar199._28_4_ = auVar194._28_4_ ^ 0xffffffff;
          auVar194 = vorps_avx(auVar142,auVar199);
          local_a60 = vandps_avx(auVar238,auVar194);
        }
        auVar259 = auVar177._0_28_;
      }
      uVar77 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar213._4_4_ = uVar77;
      auVar213._0_4_ = uVar77;
      auVar213._8_4_ = uVar77;
      auVar213._12_4_ = uVar77;
      auVar213._16_4_ = uVar77;
      auVar213._20_4_ = uVar77;
      auVar213._24_4_ = uVar77;
      auVar213._28_4_ = uVar77;
      uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar229._4_4_ = uVar77;
      auVar229._0_4_ = uVar77;
      auVar229._8_4_ = uVar77;
      auVar229._12_4_ = uVar77;
      auVar229._16_4_ = uVar77;
      auVar229._20_4_ = uVar77;
      auVar229._24_4_ = uVar77;
      auVar229._28_4_ = uVar77;
      auVar230 = ZEXT3264(auVar229);
      fVar185 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar279 = ZEXT3264(local_6a0);
      local_540 = local_6a0;
      local_520 = vminps_avx(local_560,auVar248);
      _local_580 = vmaxps_avx(local_6a0,auVar254);
      auVar256 = ZEXT3264(_local_580);
      auVar194 = vcmpps_avx(local_6a0,local_520,2);
      local_780 = vandps_avx(auVar194,auVar98);
      auVar194 = vcmpps_avx(_local_580,local_560,2);
      local_7c0 = vandps_avx(auVar194,auVar98);
      auVar98 = vorps_avx(local_7c0,local_780);
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
        auVar214 = ZEXT3264(local_800);
      }
      else {
        _local_7a0 = _local_580;
        auVar47._4_4_ = auVar240._4_4_ * fVar185;
        auVar47._0_4_ = auVar240._0_4_ * fVar185;
        auVar47._8_4_ = auVar240._8_4_ * fVar185;
        auVar47._12_4_ = auVar240._12_4_ * fVar185;
        auVar47._16_4_ = auVar240._16_4_ * fVar185;
        auVar47._20_4_ = auVar240._20_4_ * fVar185;
        auVar47._24_4_ = auVar240._24_4_ * fVar185;
        auVar47._28_4_ = auVar98._28_4_;
        auVar89 = vfmadd213ps_fma(auVar260,auVar229,auVar47);
        auVar48._4_4_ = auVar259._4_4_ * fVar185;
        auVar48._0_4_ = auVar259._0_4_ * fVar185;
        auVar48._8_4_ = auVar259._8_4_ * fVar185;
        auVar48._12_4_ = auVar259._12_4_ * fVar185;
        auVar48._16_4_ = auVar259._16_4_ * fVar185;
        auVar48._20_4_ = auVar259._20_4_ * fVar185;
        auVar48._24_4_ = auVar259._24_4_ * fVar185;
        auVar48._28_4_ = auVar98._28_4_;
        auVar272 = vfmadd213ps_fma(auVar127,auVar229,auVar48);
        auVar89 = vfmadd213ps_fma(auVar267._0_32_,auVar213,ZEXT1632(auVar89));
        auVar267 = ZEXT1664(auVar89);
        auVar145._0_8_ = local_a60._0_8_ ^ 0xffffffffffffffff;
        auVar145._8_4_ = local_a60._8_4_ ^ 0xffffffff;
        auVar145._12_4_ = local_a60._12_4_ ^ 0xffffffff;
        auVar145._16_4_ = local_a60._16_4_ ^ 0xffffffff;
        auVar145._20_4_ = local_a60._20_4_ ^ 0xffffffff;
        auVar145._24_4_ = local_a60._24_4_ ^ 0xffffffff;
        auVar145._28_4_ = local_a60._28_4_ ^ 0xffffffff;
        auVar98 = vandps_avx(ZEXT1632(auVar89),local_6c0);
        auVar178._8_4_ = 0x3e99999a;
        auVar178._0_8_ = 0x3e99999a3e99999a;
        auVar178._12_4_ = 0x3e99999a;
        auVar178._16_4_ = 0x3e99999a;
        auVar178._20_4_ = 0x3e99999a;
        auVar178._24_4_ = 0x3e99999a;
        auVar178._28_4_ = 0x3e99999a;
        auVar98 = vcmpps_avx(auVar98,auVar178,1);
        _local_600 = vorps_avx(auVar98,auVar145);
        auVar89 = vfmadd213ps_fma(auVar165,auVar213,ZEXT1632(auVar272));
        auVar98 = vandps_avx(ZEXT1632(auVar89),local_6c0);
        auVar98 = vcmpps_avx(auVar98,auVar178,1);
        auVar98 = vorps_avx(auVar98,auVar145);
        auVar128._8_4_ = 3;
        auVar128._0_8_ = 0x300000003;
        auVar128._12_4_ = 3;
        auVar128._16_4_ = 3;
        auVar128._20_4_ = 3;
        auVar128._24_4_ = 3;
        auVar128._28_4_ = 3;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar98 = vblendvps_avx(auVar146,auVar128,auVar98);
        local_620._4_4_ = local_aec;
        local_620._0_4_ = local_aec;
        local_620._8_4_ = local_aec;
        local_620._12_4_ = local_aec;
        local_620._16_4_ = local_aec;
        local_620._20_4_ = local_aec;
        local_620._24_4_ = local_aec;
        local_620._28_4_ = local_aec;
        local_5e0 = vpcmpgtd_avx2(auVar98,local_620);
        auVar98 = vpandn_avx2(local_5e0,local_780);
        local_7e0._4_4_ = local_6a0._4_4_ + local_800._4_4_;
        local_7e0._0_4_ = local_6a0._0_4_ + local_800._0_4_;
        fStack_7d8 = local_6a0._8_4_ + local_800._8_4_;
        fStack_7d4 = local_6a0._12_4_ + local_800._12_4_;
        fStack_7d0 = local_6a0._16_4_ + local_800._16_4_;
        fStack_7cc = local_6a0._20_4_ + local_800._20_4_;
        fStack_7c8 = local_6a0._24_4_ + local_800._24_4_;
        fStack_7c4 = local_6a0._28_4_ + local_800._28_4_;
        local_a00 = auVar12;
        local_9e0 = auVar13;
        while( true ) {
          local_360 = auVar98;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0x7f,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0xbf,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar98[0x1f]) break;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar194 = vblendvps_avx(auVar129,local_6a0,auVar98);
          auVar266 = vshufps_avx(auVar194,auVar194,0xb1);
          auVar266 = vminps_avx(auVar194,auVar266);
          auVar238 = vshufpd_avx(auVar266,auVar266,5);
          auVar266 = vminps_avx(auVar266,auVar238);
          auVar238 = vpermpd_avx2(auVar266,0x4e);
          auVar266 = vminps_avx(auVar266,auVar238);
          auVar194 = vcmpps_avx(auVar194,auVar266,0);
          auVar266 = auVar98 & auVar194;
          if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar266 >> 0x7f,0) != '\0') ||
                (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar266 >> 0xbf,0) != '\0') ||
              (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar266[0x1f] < '\0') {
            auVar98 = vandps_avx(auVar194,auVar98);
          }
          uVar71 = vmovmskps_avx(auVar98);
          iVar11 = 0;
          for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar11 = iVar11 + 1;
          }
          uVar74 = iVar11 << 2;
          *(undefined4 *)(local_360 + uVar74) = 0;
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_8a0._0_16_ = (undefined1  [16])aVar1;
          auVar89 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar71 = *(uint *)(local_1a0 + uVar74);
          auVar230 = ZEXT464(*(uint *)(local_540 + uVar74));
          if (auVar89._0_4_ < 0.0) {
            local_a40._0_16_ = ZEXT416(*(uint *)(local_540 + uVar74));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar267 = ZEXT1664(auVar267._0_16_);
            auVar279 = ZEXT1664(auVar279._0_16_);
            fVar185 = sqrtf(auVar89._0_4_);
            auVar230 = ZEXT1664(local_a40._0_16_);
          }
          else {
            auVar89 = vsqrtss_avx(auVar89,auVar89);
            fVar185 = auVar89._0_4_;
          }
          auVar272 = vminps_avx(local_930,local_950);
          auVar89 = vmaxps_avx(local_930,local_950);
          auVar251 = vminps_avx(local_940,_local_960);
          auVar8 = vminps_avx(auVar272,auVar251);
          auVar272 = vmaxps_avx(local_940,_local_960);
          auVar251 = vmaxps_avx(auVar89,auVar272);
          auVar89 = vandps_avx(auVar8,local_970);
          auVar272 = vandps_avx(auVar251,local_970);
          auVar89 = vmaxps_avx(auVar89,auVar272);
          auVar272 = vmovshdup_avx(auVar89);
          auVar272 = vmaxss_avx(auVar272,auVar89);
          auVar89 = vshufpd_avx(auVar89,auVar89,1);
          auVar89 = vmaxss_avx(auVar89,auVar272);
          local_a60._0_4_ = auVar89._0_4_ * 1.9073486e-06;
          local_720._0_4_ = fVar185 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar251,auVar251,0xff);
          auVar89 = vinsertps_avx(auVar230._0_16_,ZEXT416(uVar71),0x10);
          auVar214 = ZEXT1664(auVar89);
          lVar73 = 5;
          do {
            do {
              bVar80 = lVar73 == 0;
              lVar73 = lVar73 + -1;
              if (bVar80) goto LAB_01164233;
              uVar77 = auVar214._0_4_;
              auVar88._4_4_ = uVar77;
              auVar88._0_4_ = uVar77;
              auVar88._8_4_ = uVar77;
              auVar88._12_4_ = uVar77;
              auVar272 = vfmadd213ps_fma(auVar88,local_8a0._0_16_,_DAT_01f45a50);
              auVar84 = auVar214._0_16_;
              local_9a0._0_16_ = vmovshdup_avx(auVar84);
              fVar203 = local_9a0._0_4_;
              fVar204 = 1.0 - fVar203;
              fVar185 = fVar203 * fVar203;
              auVar85 = SUB6416(ZEXT464(0x40400000),0);
              auVar223 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar251 = vfmadd213ss_fma(auVar85,local_9a0._0_16_,auVar223);
              auVar89 = vfmadd213ss_fma(auVar251,ZEXT416((uint)fVar185),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar8 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar204),auVar223);
              auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)(fVar204 * fVar204)),
                                       SUB6416(ZEXT464(0x40000000),0));
              fVar200 = fVar204 * fVar204 * -fVar203 * 0.5;
              fVar201 = auVar89._0_4_ * 0.5;
              fVar202 = auVar8._0_4_ * 0.5;
              fVar203 = fVar203 * fVar203 * -fVar204 * 0.5;
              auVar153._0_4_ = fVar203 * (float)local_960._0_4_;
              auVar153._4_4_ = fVar203 * (float)local_960._4_4_;
              auVar153._8_4_ = fVar203 * fStack_958;
              auVar153._12_4_ = fVar203 * fStack_954;
              auVar169._4_4_ = fVar202;
              auVar169._0_4_ = fVar202;
              auVar169._8_4_ = fVar202;
              auVar169._12_4_ = fVar202;
              auVar89 = vfmadd132ps_fma(auVar169,auVar153,local_940);
              auVar132._4_4_ = fVar201;
              auVar132._0_4_ = fVar201;
              auVar132._8_4_ = fVar201;
              auVar132._12_4_ = fVar201;
              auVar89 = vfmadd132ps_fma(auVar132,auVar89,local_950);
              auVar154._4_4_ = fVar200;
              auVar154._0_4_ = fVar200;
              auVar154._8_4_ = fVar200;
              auVar154._12_4_ = fVar200;
              auVar89 = vfmadd132ps_fma(auVar154,auVar89,local_930);
              auVar223 = vfmadd231ss_fma(auVar223,local_9a0._0_16_,ZEXT416(0x41100000));
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_9a0._0_16_,
                                       ZEXT416(0x40800000));
              local_900._0_16_ = auVar8;
              local_700._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar272,auVar89);
              _local_860 = auVar89;
              auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
              auVar272 = vfmadd213ss_fma(auVar85,local_9a0._0_16_,ZEXT416(0xbf800000));
              local_9c0._0_16_ = auVar272;
              local_a40._0_16_ = auVar89;
              if (auVar89._0_4_ < 0.0) {
                local_9e0._0_4_ = auVar251._0_4_;
                local_a00._0_16_ = ZEXT416((uint)fVar204);
                local_a20._0_4_ = fVar185;
                local_920._0_16_ = auVar223;
                local_880._0_4_ = fVar204 * -2.0;
                auVar279._0_4_ = sqrtf(auVar89._0_4_);
                auVar279._4_60_ = extraout_var;
                auVar251 = ZEXT416((uint)local_9e0._0_4_);
                auVar214 = ZEXT1664(auVar84);
                auVar89 = auVar279._0_16_;
                fVar200 = (float)local_880._0_4_;
                auVar272 = local_a00._0_16_;
                fVar185 = (float)local_a20._0_4_;
                auVar223 = local_920._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar200 = fVar204 * -2.0;
                auVar272 = ZEXT416((uint)fVar204);
              }
              fVar202 = auVar272._0_4_;
              fVar201 = local_9a0._0_4_;
              auVar251 = vfmadd213ss_fma(auVar251,ZEXT416((uint)(fVar201 + fVar201)),
                                         ZEXT416((uint)(fVar201 * fVar201 * 3.0)));
              auVar114 = SUB6416(ZEXT464(0x40000000),0);
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_9a0._0_16_,auVar114);
              auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * fVar202 * -3.0)),
                                       ZEXT416((uint)(fVar202 + fVar202)),auVar8);
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar201 * (fVar202 + fVar202))),auVar272,
                                         auVar272);
              auVar272 = vfmadd213ss_fma(ZEXT416((uint)fVar200),local_9a0._0_16_,
                                         ZEXT416((uint)fVar185));
              fVar185 = auVar8._0_4_ * 0.5;
              fVar200 = auVar272._0_4_ * 0.5;
              auVar133._0_4_ = (float)local_960._0_4_ * fVar200;
              auVar133._4_4_ = (float)local_960._4_4_ * fVar200;
              auVar133._8_4_ = fStack_958 * fVar200;
              auVar133._12_4_ = fStack_954 * fVar200;
              auVar116._4_4_ = fVar185;
              auVar116._0_4_ = fVar185;
              auVar116._8_4_ = fVar185;
              auVar116._12_4_ = fVar185;
              auVar272 = vfmadd213ps_fma(auVar116,local_940,auVar133);
              fVar185 = auVar85._0_4_ * 0.5;
              fVar200 = auVar251._0_4_ * 0.5;
              auVar134._4_4_ = fVar200;
              auVar134._0_4_ = fVar200;
              auVar134._8_4_ = fVar200;
              auVar134._12_4_ = fVar200;
              auVar272 = vfmadd213ps_fma(auVar134,local_950,auVar272);
              auVar252._4_4_ = fVar185;
              auVar252._0_4_ = fVar185;
              auVar252._8_4_ = fVar185;
              auVar252._12_4_ = fVar185;
              auVar85 = vfmadd213ps_fma(auVar252,local_930,auVar272);
              auVar8 = vfmadd213ss_fma(local_9a0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar114);
              auVar90._0_4_ = (float)local_960._0_4_ * (float)local_9c0._0_4_;
              auVar90._4_4_ = (float)local_960._4_4_ * (float)local_9c0._0_4_;
              auVar90._8_4_ = fStack_958 * (float)local_9c0._0_4_;
              auVar90._12_4_ = fStack_954 * (float)local_9c0._0_4_;
              auVar117._4_4_ = local_900._0_4_;
              auVar117._0_4_ = local_900._0_4_;
              auVar117._8_4_ = local_900._0_4_;
              auVar117._12_4_ = local_900._0_4_;
              auVar272 = vfmadd213ps_fma(auVar117,local_940,auVar90);
              uVar77 = auVar223._0_4_;
              auVar135._4_4_ = uVar77;
              auVar135._0_4_ = uVar77;
              auVar135._8_4_ = uVar77;
              auVar135._12_4_ = uVar77;
              auVar272 = vfmadd213ps_fma(auVar135,local_950,auVar272);
              auVar251 = vdpps_avx(auVar85,auVar85,0x7f);
              uVar77 = auVar8._0_4_;
              auVar118._4_4_ = uVar77;
              auVar118._0_4_ = uVar77;
              auVar118._8_4_ = uVar77;
              auVar118._12_4_ = uVar77;
              auVar223 = vfmadd213ps_fma(auVar118,local_930,auVar272);
              auVar272 = vblendps_avx(auVar251,_DAT_01f45a50,0xe);
              auVar8 = vrsqrtss_avx(auVar272,auVar272);
              fVar201 = auVar251._0_4_;
              fVar185 = auVar8._0_4_;
              auVar8 = vdpps_avx(auVar85,auVar223,0x7f);
              fVar185 = fVar185 * 1.5 + fVar201 * -0.5 * fVar185 * fVar185 * fVar185;
              auVar119._0_4_ = auVar223._0_4_ * fVar201;
              auVar119._4_4_ = auVar223._4_4_ * fVar201;
              auVar119._8_4_ = auVar223._8_4_ * fVar201;
              auVar119._12_4_ = auVar223._12_4_ * fVar201;
              fVar200 = auVar8._0_4_;
              auVar189._0_4_ = auVar85._0_4_ * fVar200;
              auVar189._4_4_ = auVar85._4_4_ * fVar200;
              fVar202 = auVar85._8_4_;
              auVar189._8_4_ = fVar202 * fVar200;
              fVar203 = auVar85._12_4_;
              auVar189._12_4_ = fVar203 * fVar200;
              auVar8 = vsubps_avx(auVar119,auVar189);
              auVar272 = vrcpss_avx(auVar272,auVar272);
              auVar223 = vfnmadd213ss_fma(auVar272,auVar251,auVar114);
              fVar200 = auVar272._0_4_ * auVar223._0_4_;
              auVar272 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                    ZEXT416((uint)(auVar214._0_4_ * (float)local_720._0_4_)));
              auVar240 = ZEXT1664(auVar272);
              auVar224._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = -fVar202;
              auVar224._12_4_ = -fVar203;
              auVar155._0_4_ = fVar185 * auVar8._0_4_ * fVar200;
              auVar155._4_4_ = fVar185 * auVar8._4_4_ * fVar200;
              auVar155._8_4_ = fVar185 * auVar8._8_4_ * fVar200;
              auVar155._12_4_ = fVar185 * auVar8._12_4_ * fVar200;
              auVar246._0_4_ = auVar85._0_4_ * fVar185;
              auVar246._4_4_ = auVar85._4_4_ * fVar185;
              auVar246._8_4_ = fVar202 * fVar185;
              auVar246._12_4_ = fVar203 * fVar185;
              local_9a0._0_16_ = auVar85;
              local_900._0_4_ = auVar272._0_4_;
              if (fVar201 < -fVar201) {
                local_9c0._0_4_ = auVar89._0_4_;
                local_9e0._0_16_ = auVar224;
                local_a00._0_16_ = auVar246;
                local_a20._0_16_ = auVar155;
                fVar185 = sqrtf(fVar201);
                auVar240 = ZEXT464((uint)local_900._0_4_);
                auVar89 = ZEXT416((uint)local_9c0._0_4_);
                auVar155 = local_a20._0_16_;
                auVar224 = local_9e0._0_16_;
                auVar246 = local_a00._0_16_;
              }
              else {
                auVar272 = vsqrtss_avx(auVar251,auVar251);
                fVar185 = auVar272._0_4_;
              }
              auVar272 = vdpps_avx(_local_860,auVar246,0x7f);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)local_a60._0_4_),auVar89,auVar240._0_16_);
              auVar251 = vdpps_avx(auVar224,auVar246,0x7f);
              auVar8 = vdpps_avx(_local_860,auVar155,0x7f);
              auVar223 = vdpps_avx(local_8a0._0_16_,auVar246,0x7f);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_a60._0_4_ / fVar185)),auVar85);
              fVar185 = auVar251._0_4_ + auVar8._0_4_;
              auVar267 = ZEXT464((uint)fVar185);
              auVar91._0_4_ = auVar272._0_4_ * auVar272._0_4_;
              auVar91._4_4_ = auVar272._4_4_ * auVar272._4_4_;
              auVar91._8_4_ = auVar272._8_4_ * auVar272._8_4_;
              auVar91._12_4_ = auVar272._12_4_ * auVar272._12_4_;
              auVar89 = vdpps_avx(_local_860,auVar224,0x7f);
              auVar8 = vsubps_avx(local_a40._0_16_,auVar91);
              auVar251 = vrsqrtss_avx(auVar8,auVar8);
              fVar201 = auVar8._0_4_;
              fVar200 = auVar251._0_4_;
              fVar200 = fVar200 * 1.5 + fVar201 * -0.5 * fVar200 * fVar200 * fVar200;
              auVar251 = vdpps_avx(_local_860,local_8a0._0_16_,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar89,auVar272,ZEXT416((uint)fVar185));
              auVar251 = vfnmadd231ss_fma(auVar251,auVar272,auVar223);
              if (fVar201 < 0.0) {
                local_9c0._0_16_ = auVar272;
                local_9e0._0_4_ = auVar85._0_4_;
                local_a00._0_16_ = ZEXT416((uint)fVar185);
                local_a20._0_16_ = auVar223;
                local_920._0_16_ = auVar89;
                local_880._0_4_ = fVar200;
                local_740._0_16_ = auVar251;
                fVar185 = sqrtf(fVar201);
                auVar267 = ZEXT1664(local_a00._0_16_);
                auVar240 = ZEXT464((uint)local_900._0_4_);
                fVar200 = (float)local_880._0_4_;
                auVar251 = local_740._0_16_;
                auVar272 = local_9c0._0_16_;
                auVar223 = local_a20._0_16_;
                auVar89 = local_920._0_16_;
                fVar201 = (float)local_9e0._0_4_;
              }
              else {
                auVar8 = vsqrtss_avx(auVar8,auVar8);
                fVar185 = auVar8._0_4_;
                fVar201 = auVar85._0_4_;
              }
              auVar256 = ZEXT1664(auVar272);
              auVar230 = ZEXT1664(local_9a0._0_16_);
              auVar8 = vpermilps_avx(local_700._0_16_,0xff);
              fVar185 = fVar185 - auVar8._0_4_;
              auVar8 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
              auVar85 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar200),auVar8);
              auVar279 = ZEXT1664(auVar85);
              auVar156._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
              auVar156._8_4_ = auVar223._8_4_ ^ 0x80000000;
              auVar156._12_4_ = auVar223._12_4_ ^ 0x80000000;
              auVar170._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar170._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar170._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar89 = ZEXT416((uint)(auVar251._0_4_ * fVar200));
              auVar114 = auVar267._0_16_;
              auVar251 = vfmsub231ss_fma(ZEXT416((uint)(auVar223._0_4_ * auVar85._0_4_)),auVar114,
                                         auVar89);
              auVar89 = vinsertps_avx(auVar170,auVar89,0x1c);
              uVar77 = auVar251._0_4_;
              auVar171._4_4_ = uVar77;
              auVar171._0_4_ = uVar77;
              auVar171._8_4_ = uVar77;
              auVar171._12_4_ = uVar77;
              auVar89 = vdivps_avx(auVar89,auVar171);
              auVar251 = vinsertps_avx(auVar114,auVar156,0x10);
              auVar251 = vdivps_avx(auVar251,auVar171);
              fVar200 = auVar272._0_4_;
              auVar136._0_4_ = fVar200 * auVar89._0_4_ + fVar185 * auVar251._0_4_;
              auVar136._4_4_ = fVar200 * auVar89._4_4_ + fVar185 * auVar251._4_4_;
              auVar136._8_4_ = fVar200 * auVar89._8_4_ + fVar185 * auVar251._8_4_;
              auVar136._12_4_ = fVar200 * auVar89._12_4_ + fVar185 * auVar251._12_4_;
              auVar251 = vsubps_avx(auVar84,auVar136);
              auVar214 = ZEXT1664(auVar251);
              auVar89 = vandps_avx(auVar272,local_970);
            } while (fVar201 <= auVar89._0_4_);
            auVar223 = vfmadd231ss_fma(ZEXT416((uint)(auVar240._0_4_ + fVar201)),local_760._0_16_,
                                       ZEXT416(0x36000000));
            auVar89 = vandps_avx(ZEXT416((uint)fVar185),local_970);
          } while (auVar223._0_4_ <= auVar89._0_4_);
          fVar185 = auVar251._0_4_ + (float)local_820._0_4_;
          if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar185) {
            fVar200 = (ray->super_RayK<1>).tfar;
            auVar240 = ZEXT464((uint)fVar200);
            if (fVar185 <= fVar200) {
              auVar89 = vmovshdup_avx(auVar251);
              fVar201 = auVar89._0_4_;
              if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                auVar89 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar202 = auVar89._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar72].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar202 = fVar202 * 1.5 + local_a40._0_4_ * -0.5 * fVar202 * fVar202 * fVar202;
                  auVar157._0_4_ = fVar202 * (float)local_860._0_4_;
                  auVar157._4_4_ = fVar202 * (float)local_860._4_4_;
                  auVar157._8_4_ = fVar202 * fStack_858;
                  auVar157._12_4_ = fVar202 * fStack_854;
                  auVar223 = vfmadd213ps_fma(auVar8,auVar157,local_9a0._0_16_);
                  auVar89 = vshufps_avx(auVar157,auVar157,0xc9);
                  auVar251 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                  auVar158._0_4_ = auVar157._0_4_ * auVar251._0_4_;
                  auVar158._4_4_ = auVar157._4_4_ * auVar251._4_4_;
                  auVar158._8_4_ = auVar157._8_4_ * auVar251._8_4_;
                  auVar158._12_4_ = auVar157._12_4_ * auVar251._12_4_;
                  auVar8 = vfmsub231ps_fma(auVar158,local_9a0._0_16_,auVar89);
                  auVar89 = vshufps_avx(auVar8,auVar8,0xc9);
                  auVar251 = vshufps_avx(auVar223,auVar223,0xc9);
                  auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                  auVar92._0_4_ = auVar223._0_4_ * auVar8._0_4_;
                  auVar92._4_4_ = auVar223._4_4_ * auVar8._4_4_;
                  auVar92._8_4_ = auVar223._8_4_ * auVar8._8_4_;
                  auVar92._12_4_ = auVar223._12_4_ * auVar8._12_4_;
                  auVar251 = vfmsub231ps_fma(auVar92,auVar89,auVar251);
                  auVar89 = vshufps_avx(auVar251,auVar251,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar185;
                    uVar81 = vmovlps_avx(auVar89);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar81;
                    (ray->Ng).field_0.field_0.z = auVar251._0_4_;
                    ray->u = fVar201;
                    ray->v = 0.0;
                    ray->primID = local_840._0_4_;
                    ray->geomID = uVar72;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_8d0 = vmovlps_avx(auVar89);
                    local_8c8 = auVar251._0_4_;
                    local_8c4 = fVar201;
                    local_8c0 = 0;
                    local_8bc = local_840._0_4_;
                    local_8b8 = uVar72;
                    local_8b4 = context->user->instID[0];
                    local_8b0 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar185;
                    local_640._0_4_ = 0xffffffff;
                    local_a98.valid = (int *)local_640;
                    local_a98.geometryUserPtr = pGVar4->userPtr;
                    local_a98.context = context->user;
                    local_a98.hit = (RTCHitN *)&local_8d0;
                    local_a98.N = 1;
                    local_a98.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01164340:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar230 = ZEXT1664(auVar230._0_16_);
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        (*p_Var5)(&local_a98);
                        if (*local_a98.valid == 0) goto LAB_011643d7;
                      }
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a98.hit;
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a98.hit + 4);
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a98.hit + 8);
                      *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                      *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                      *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                      *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                      *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                      *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                    }
                    else {
                      auVar230 = ZEXT1664(local_9a0._0_16_);
                      auVar240 = ZEXT464((uint)fVar200);
                      auVar256 = ZEXT1664(auVar272);
                      auVar267 = ZEXT1664(auVar114);
                      auVar279 = ZEXT1664(auVar85);
                      (*pGVar4->intersectionFilterN)(&local_a98);
                      if (*local_a98.valid != 0) goto LAB_01164340;
LAB_011643d7:
                      (ray->super_RayK<1>).tfar = fVar200;
                    }
                  }
                }
              }
            }
          }
LAB_01164233:
          fVar185 = (ray->super_RayK<1>).tfar;
          auVar107._4_4_ = fVar185;
          auVar107._0_4_ = fVar185;
          auVar107._8_4_ = fVar185;
          auVar107._12_4_ = fVar185;
          auVar107._16_4_ = fVar185;
          auVar107._20_4_ = fVar185;
          auVar107._24_4_ = fVar185;
          auVar107._28_4_ = fVar185;
          auVar98 = vcmpps_avx(_local_7e0,auVar107,2);
          auVar98 = vandps_avx(auVar98,local_360);
        }
        auVar108._0_4_ = local_800._0_4_ + (float)local_7a0._0_4_;
        auVar108._4_4_ = local_800._4_4_ + (float)local_7a0._4_4_;
        auVar108._8_4_ = local_800._8_4_ + fStack_798;
        auVar108._12_4_ = local_800._12_4_ + fStack_794;
        auVar108._16_4_ = local_800._16_4_ + fStack_790;
        auVar108._20_4_ = local_800._20_4_ + fStack_78c;
        auVar108._24_4_ = local_800._24_4_ + fStack_788;
        auVar108._28_4_ = local_800._28_4_ + fStack_784;
        fVar200 = (ray->super_RayK<1>).tfar;
        fVar185 = (ray->super_RayK<1>).tfar;
        auVar147._4_4_ = fVar185;
        auVar147._0_4_ = fVar185;
        auVar147._8_4_ = fVar185;
        auVar147._12_4_ = fVar185;
        auVar147._16_4_ = fVar185;
        auVar147._20_4_ = fVar185;
        auVar147._24_4_ = fVar185;
        auVar147._28_4_ = fVar185;
        auVar98 = vcmpps_avx(auVar108,auVar147,2);
        local_7c0 = vandps_avx(auVar98,local_7c0);
        auVar109._8_4_ = 3;
        auVar109._0_8_ = 0x300000003;
        auVar109._12_4_ = 3;
        auVar109._16_4_ = 3;
        auVar109._20_4_ = 3;
        auVar109._24_4_ = 3;
        auVar109._28_4_ = 3;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar98 = vblendvps_avx(auVar148,auVar109,_local_600);
        _local_7e0 = vpcmpgtd_avx2(auVar98,local_620);
        auVar98 = vpandn_avx2(_local_7e0,local_7c0);
        local_6a0 = _local_580;
        local_7a0._4_4_ = local_800._4_4_ + (float)local_580._4_4_;
        local_7a0._0_4_ = local_800._0_4_ + (float)local_580._0_4_;
        fStack_798 = local_800._8_4_ + fStack_578;
        fStack_794 = local_800._12_4_ + fStack_574;
        fStack_790 = local_800._16_4_ + fStack_570;
        fStack_78c = local_800._20_4_ + fStack_56c;
        fStack_788 = local_800._24_4_ + fStack_568;
        fStack_784 = local_800._28_4_ + fStack_564;
        while( true ) {
          auVar214 = ZEXT3264(local_800);
          local_640 = auVar98;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0x7f,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0xbf,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar98[0x1f]) break;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar194 = vblendvps_avx(auVar130,local_6a0,auVar98);
          auVar266 = vshufps_avx(auVar194,auVar194,0xb1);
          auVar266 = vminps_avx(auVar194,auVar266);
          auVar238 = vshufpd_avx(auVar266,auVar266,5);
          auVar266 = vminps_avx(auVar266,auVar238);
          auVar238 = vpermpd_avx2(auVar266,0x4e);
          auVar266 = vminps_avx(auVar266,auVar238);
          auVar194 = vcmpps_avx(auVar194,auVar266,0);
          auVar266 = auVar98 & auVar194;
          if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar266 >> 0x7f,0) != '\0') ||
                (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar266 >> 0xbf,0) != '\0') ||
              (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar266[0x1f] < '\0') {
            auVar98 = vandps_avx(auVar194,auVar98);
          }
          uVar71 = vmovmskps_avx(auVar98);
          iVar11 = 0;
          for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar11 = iVar11 + 1;
          }
          uVar74 = iVar11 << 2;
          *(undefined4 *)(local_640 + uVar74) = 0;
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_8a0._0_16_ = (undefined1  [16])aVar1;
          auVar89 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar71 = *(uint *)(local_1c0 + uVar74);
          auVar230 = ZEXT464(*(uint *)(local_560 + uVar74));
          if (auVar89._0_4_ < 0.0) {
            local_a40._0_16_ = ZEXT416(*(uint *)(local_560 + uVar74));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar267 = ZEXT1664(auVar267._0_16_);
            auVar279 = ZEXT1664(auVar279._0_16_);
            fVar185 = sqrtf(auVar89._0_4_);
            auVar230 = ZEXT1664(local_a40._0_16_);
          }
          else {
            auVar89 = vsqrtss_avx(auVar89,auVar89);
            fVar185 = auVar89._0_4_;
          }
          auVar272 = vminps_avx(local_930,local_950);
          auVar89 = vmaxps_avx(local_930,local_950);
          auVar251 = vminps_avx(local_940,_local_960);
          auVar8 = vminps_avx(auVar272,auVar251);
          auVar272 = vmaxps_avx(local_940,_local_960);
          auVar251 = vmaxps_avx(auVar89,auVar272);
          auVar89 = vandps_avx(auVar8,local_970);
          auVar272 = vandps_avx(auVar251,local_970);
          auVar89 = vmaxps_avx(auVar89,auVar272);
          auVar272 = vmovshdup_avx(auVar89);
          auVar272 = vmaxss_avx(auVar272,auVar89);
          auVar89 = vshufpd_avx(auVar89,auVar89,1);
          auVar89 = vmaxss_avx(auVar89,auVar272);
          local_a60._0_4_ = auVar89._0_4_ * 1.9073486e-06;
          local_720._0_4_ = fVar185 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar251,auVar251,0xff);
          auVar89 = vinsertps_avx(auVar230._0_16_,ZEXT416(uVar71),0x10);
          auVar214 = ZEXT1664(auVar89);
          lVar73 = 5;
          do {
            do {
              bVar80 = lVar73 == 0;
              lVar73 = lVar73 + -1;
              if (bVar80) goto LAB_01164cef;
              uVar77 = auVar214._0_4_;
              auVar93._4_4_ = uVar77;
              auVar93._0_4_ = uVar77;
              auVar93._8_4_ = uVar77;
              auVar93._12_4_ = uVar77;
              auVar272 = vfmadd213ps_fma(auVar93,local_8a0._0_16_,_DAT_01f45a50);
              auVar84 = auVar214._0_16_;
              local_9a0._0_16_ = vmovshdup_avx(auVar84);
              fVar203 = local_9a0._0_4_;
              fVar204 = 1.0 - fVar203;
              fVar185 = fVar203 * fVar203;
              auVar85 = SUB6416(ZEXT464(0x40400000),0);
              auVar223 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar251 = vfmadd213ss_fma(auVar85,local_9a0._0_16_,auVar223);
              auVar89 = vfmadd213ss_fma(auVar251,ZEXT416((uint)fVar185),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar8 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar204),auVar223);
              auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)(fVar204 * fVar204)),
                                       SUB6416(ZEXT464(0x40000000),0));
              fVar200 = fVar204 * fVar204 * -fVar203 * 0.5;
              fVar201 = auVar89._0_4_ * 0.5;
              fVar202 = auVar8._0_4_ * 0.5;
              fVar203 = fVar203 * fVar203 * -fVar204 * 0.5;
              auVar159._0_4_ = fVar203 * (float)local_960._0_4_;
              auVar159._4_4_ = fVar203 * (float)local_960._4_4_;
              auVar159._8_4_ = fVar203 * fStack_958;
              auVar159._12_4_ = fVar203 * fStack_954;
              auVar172._4_4_ = fVar202;
              auVar172._0_4_ = fVar202;
              auVar172._8_4_ = fVar202;
              auVar172._12_4_ = fVar202;
              auVar89 = vfmadd132ps_fma(auVar172,auVar159,local_940);
              auVar137._4_4_ = fVar201;
              auVar137._0_4_ = fVar201;
              auVar137._8_4_ = fVar201;
              auVar137._12_4_ = fVar201;
              auVar89 = vfmadd132ps_fma(auVar137,auVar89,local_950);
              auVar160._4_4_ = fVar200;
              auVar160._0_4_ = fVar200;
              auVar160._8_4_ = fVar200;
              auVar160._12_4_ = fVar200;
              auVar89 = vfmadd132ps_fma(auVar160,auVar89,local_930);
              auVar223 = vfmadd231ss_fma(auVar223,local_9a0._0_16_,ZEXT416(0x41100000));
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_9a0._0_16_,
                                       ZEXT416(0x40800000));
              local_900._0_16_ = auVar8;
              local_700._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar272,auVar89);
              _local_860 = auVar89;
              auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
              auVar272 = vfmadd213ss_fma(auVar85,local_9a0._0_16_,ZEXT416(0xbf800000));
              local_9c0._0_16_ = auVar272;
              local_a40._0_16_ = auVar89;
              if (auVar89._0_4_ < 0.0) {
                local_9e0._0_4_ = auVar251._0_4_;
                local_a00._0_16_ = ZEXT416((uint)fVar204);
                local_a20._0_4_ = fVar185;
                local_920._0_16_ = auVar223;
                local_880._0_4_ = fVar204 * -2.0;
                auVar267._0_4_ = sqrtf(auVar89._0_4_);
                auVar267._4_60_ = extraout_var_00;
                auVar251 = ZEXT416((uint)local_9e0._0_4_);
                auVar214 = ZEXT1664(auVar84);
                auVar89 = auVar267._0_16_;
                fVar200 = (float)local_880._0_4_;
                auVar272 = local_a00._0_16_;
                fVar185 = (float)local_a20._0_4_;
                auVar223 = local_920._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar200 = fVar204 * -2.0;
                auVar272 = ZEXT416((uint)fVar204);
              }
              fVar202 = auVar272._0_4_;
              fVar201 = local_9a0._0_4_;
              auVar251 = vfmadd213ss_fma(auVar251,ZEXT416((uint)(fVar201 + fVar201)),
                                         ZEXT416((uint)(fVar201 * fVar201 * 3.0)));
              auVar114 = SUB6416(ZEXT464(0x40000000),0);
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_9a0._0_16_,auVar114);
              auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * fVar202 * -3.0)),
                                       ZEXT416((uint)(fVar202 + fVar202)),auVar8);
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar201 * (fVar202 + fVar202))),auVar272,
                                         auVar272);
              auVar272 = vfmadd213ss_fma(ZEXT416((uint)fVar200),local_9a0._0_16_,
                                         ZEXT416((uint)fVar185));
              fVar185 = auVar8._0_4_ * 0.5;
              fVar200 = auVar272._0_4_ * 0.5;
              auVar138._0_4_ = (float)local_960._0_4_ * fVar200;
              auVar138._4_4_ = (float)local_960._4_4_ * fVar200;
              auVar138._8_4_ = fStack_958 * fVar200;
              auVar138._12_4_ = fStack_954 * fVar200;
              auVar120._4_4_ = fVar185;
              auVar120._0_4_ = fVar185;
              auVar120._8_4_ = fVar185;
              auVar120._12_4_ = fVar185;
              auVar272 = vfmadd213ps_fma(auVar120,local_940,auVar138);
              fVar185 = auVar85._0_4_ * 0.5;
              fVar200 = auVar251._0_4_ * 0.5;
              auVar139._4_4_ = fVar200;
              auVar139._0_4_ = fVar200;
              auVar139._8_4_ = fVar200;
              auVar139._12_4_ = fVar200;
              auVar272 = vfmadd213ps_fma(auVar139,local_950,auVar272);
              auVar253._4_4_ = fVar185;
              auVar253._0_4_ = fVar185;
              auVar253._8_4_ = fVar185;
              auVar253._12_4_ = fVar185;
              auVar85 = vfmadd213ps_fma(auVar253,local_930,auVar272);
              auVar8 = vfmadd213ss_fma(local_9a0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar114);
              auVar94._0_4_ = (float)local_960._0_4_ * (float)local_9c0._0_4_;
              auVar94._4_4_ = (float)local_960._4_4_ * (float)local_9c0._0_4_;
              auVar94._8_4_ = fStack_958 * (float)local_9c0._0_4_;
              auVar94._12_4_ = fStack_954 * (float)local_9c0._0_4_;
              auVar121._4_4_ = local_900._0_4_;
              auVar121._0_4_ = local_900._0_4_;
              auVar121._8_4_ = local_900._0_4_;
              auVar121._12_4_ = local_900._0_4_;
              auVar272 = vfmadd213ps_fma(auVar121,local_940,auVar94);
              uVar77 = auVar223._0_4_;
              auVar140._4_4_ = uVar77;
              auVar140._0_4_ = uVar77;
              auVar140._8_4_ = uVar77;
              auVar140._12_4_ = uVar77;
              auVar272 = vfmadd213ps_fma(auVar140,local_950,auVar272);
              auVar251 = vdpps_avx(auVar85,auVar85,0x7f);
              uVar77 = auVar8._0_4_;
              auVar122._4_4_ = uVar77;
              auVar122._0_4_ = uVar77;
              auVar122._8_4_ = uVar77;
              auVar122._12_4_ = uVar77;
              auVar223 = vfmadd213ps_fma(auVar122,local_930,auVar272);
              auVar272 = vblendps_avx(auVar251,_DAT_01f45a50,0xe);
              auVar8 = vrsqrtss_avx(auVar272,auVar272);
              fVar201 = auVar251._0_4_;
              fVar185 = auVar8._0_4_;
              auVar8 = vdpps_avx(auVar85,auVar223,0x7f);
              fVar185 = fVar185 * 1.5 + fVar201 * -0.5 * fVar185 * fVar185 * fVar185;
              auVar123._0_4_ = auVar223._0_4_ * fVar201;
              auVar123._4_4_ = auVar223._4_4_ * fVar201;
              auVar123._8_4_ = auVar223._8_4_ * fVar201;
              auVar123._12_4_ = auVar223._12_4_ * fVar201;
              fVar200 = auVar8._0_4_;
              auVar190._0_4_ = auVar85._0_4_ * fVar200;
              auVar190._4_4_ = auVar85._4_4_ * fVar200;
              fVar202 = auVar85._8_4_;
              auVar190._8_4_ = fVar202 * fVar200;
              fVar203 = auVar85._12_4_;
              auVar190._12_4_ = fVar203 * fVar200;
              auVar8 = vsubps_avx(auVar123,auVar190);
              auVar272 = vrcpss_avx(auVar272,auVar272);
              auVar223 = vfnmadd213ss_fma(auVar272,auVar251,auVar114);
              fVar200 = auVar272._0_4_ * auVar223._0_4_;
              auVar272 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                    ZEXT416((uint)(auVar214._0_4_ * (float)local_720._0_4_)));
              auVar240 = ZEXT1664(auVar272);
              auVar225._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = -fVar202;
              auVar225._12_4_ = -fVar203;
              auVar161._0_4_ = fVar185 * auVar8._0_4_ * fVar200;
              auVar161._4_4_ = fVar185 * auVar8._4_4_ * fVar200;
              auVar161._8_4_ = fVar185 * auVar8._8_4_ * fVar200;
              auVar161._12_4_ = fVar185 * auVar8._12_4_ * fVar200;
              auVar247._0_4_ = auVar85._0_4_ * fVar185;
              auVar247._4_4_ = auVar85._4_4_ * fVar185;
              auVar247._8_4_ = fVar202 * fVar185;
              auVar247._12_4_ = fVar203 * fVar185;
              local_9a0._0_16_ = auVar85;
              local_900._0_4_ = auVar272._0_4_;
              if (fVar201 < -fVar201) {
                local_9c0._0_4_ = auVar89._0_4_;
                local_9e0._0_16_ = auVar225;
                local_a00._0_16_ = auVar247;
                local_a20._0_16_ = auVar161;
                fVar185 = sqrtf(fVar201);
                auVar240 = ZEXT464((uint)local_900._0_4_);
                auVar89 = ZEXT416((uint)local_9c0._0_4_);
                auVar161 = local_a20._0_16_;
                auVar225 = local_9e0._0_16_;
                auVar247 = local_a00._0_16_;
              }
              else {
                auVar272 = vsqrtss_avx(auVar251,auVar251);
                fVar185 = auVar272._0_4_;
              }
              auVar272 = vdpps_avx(_local_860,auVar247,0x7f);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)local_a60._0_4_),auVar89,auVar240._0_16_);
              auVar251 = vdpps_avx(auVar225,auVar247,0x7f);
              auVar8 = vdpps_avx(_local_860,auVar161,0x7f);
              auVar223 = vdpps_avx(local_8a0._0_16_,auVar247,0x7f);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_a60._0_4_ / fVar185)),auVar85);
              fVar185 = auVar251._0_4_ + auVar8._0_4_;
              auVar267 = ZEXT464((uint)fVar185);
              auVar95._0_4_ = auVar272._0_4_ * auVar272._0_4_;
              auVar95._4_4_ = auVar272._4_4_ * auVar272._4_4_;
              auVar95._8_4_ = auVar272._8_4_ * auVar272._8_4_;
              auVar95._12_4_ = auVar272._12_4_ * auVar272._12_4_;
              auVar89 = vdpps_avx(_local_860,auVar225,0x7f);
              auVar8 = vsubps_avx(local_a40._0_16_,auVar95);
              auVar251 = vrsqrtss_avx(auVar8,auVar8);
              fVar201 = auVar8._0_4_;
              fVar200 = auVar251._0_4_;
              fVar200 = fVar200 * 1.5 + fVar201 * -0.5 * fVar200 * fVar200 * fVar200;
              auVar251 = vdpps_avx(_local_860,local_8a0._0_16_,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar89,auVar272,ZEXT416((uint)fVar185));
              auVar251 = vfnmadd231ss_fma(auVar251,auVar272,auVar223);
              if (fVar201 < 0.0) {
                local_9c0._0_16_ = auVar272;
                local_9e0._0_4_ = auVar85._0_4_;
                local_a00._0_16_ = ZEXT416((uint)fVar185);
                local_a20._0_16_ = auVar223;
                local_920._0_16_ = auVar89;
                local_880._0_4_ = fVar200;
                local_740._0_16_ = auVar251;
                fVar185 = sqrtf(fVar201);
                auVar267 = ZEXT1664(local_a00._0_16_);
                auVar240 = ZEXT464((uint)local_900._0_4_);
                fVar200 = (float)local_880._0_4_;
                auVar251 = local_740._0_16_;
                auVar272 = local_9c0._0_16_;
                auVar223 = local_a20._0_16_;
                auVar89 = local_920._0_16_;
                fVar201 = (float)local_9e0._0_4_;
              }
              else {
                auVar8 = vsqrtss_avx(auVar8,auVar8);
                fVar185 = auVar8._0_4_;
                fVar201 = auVar85._0_4_;
              }
              auVar256 = ZEXT1664(auVar272);
              auVar230 = ZEXT1664(local_9a0._0_16_);
              auVar8 = vpermilps_avx(local_700._0_16_,0xff);
              fVar185 = fVar185 - auVar8._0_4_;
              auVar8 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
              auVar85 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar200),auVar8);
              auVar279 = ZEXT1664(auVar85);
              auVar162._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
              auVar162._8_4_ = auVar223._8_4_ ^ 0x80000000;
              auVar162._12_4_ = auVar223._12_4_ ^ 0x80000000;
              auVar173._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar173._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar173._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar89 = ZEXT416((uint)(auVar251._0_4_ * fVar200));
              auVar114 = auVar267._0_16_;
              auVar251 = vfmsub231ss_fma(ZEXT416((uint)(auVar223._0_4_ * auVar85._0_4_)),auVar114,
                                         auVar89);
              auVar89 = vinsertps_avx(auVar173,auVar89,0x1c);
              uVar77 = auVar251._0_4_;
              auVar174._4_4_ = uVar77;
              auVar174._0_4_ = uVar77;
              auVar174._8_4_ = uVar77;
              auVar174._12_4_ = uVar77;
              auVar89 = vdivps_avx(auVar89,auVar174);
              auVar251 = vinsertps_avx(auVar114,auVar162,0x10);
              auVar251 = vdivps_avx(auVar251,auVar174);
              fVar200 = auVar272._0_4_;
              auVar141._0_4_ = fVar200 * auVar89._0_4_ + fVar185 * auVar251._0_4_;
              auVar141._4_4_ = fVar200 * auVar89._4_4_ + fVar185 * auVar251._4_4_;
              auVar141._8_4_ = fVar200 * auVar89._8_4_ + fVar185 * auVar251._8_4_;
              auVar141._12_4_ = fVar200 * auVar89._12_4_ + fVar185 * auVar251._12_4_;
              auVar251 = vsubps_avx(auVar84,auVar141);
              auVar214 = ZEXT1664(auVar251);
              auVar89 = vandps_avx(auVar272,local_970);
            } while (fVar201 <= auVar89._0_4_);
            auVar223 = vfmadd231ss_fma(ZEXT416((uint)(auVar240._0_4_ + fVar201)),local_760._0_16_,
                                       ZEXT416(0x36000000));
            auVar89 = vandps_avx(ZEXT416((uint)fVar185),local_970);
          } while (auVar223._0_4_ <= auVar89._0_4_);
          fVar185 = auVar251._0_4_ + (float)local_820._0_4_;
          if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar185) {
            fVar200 = (ray->super_RayK<1>).tfar;
            auVar240 = ZEXT464((uint)fVar200);
            if (fVar185 <= fVar200) {
              auVar89 = vmovshdup_avx(auVar251);
              fVar201 = auVar89._0_4_;
              if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                auVar89 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar202 = auVar89._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar72].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar202 = fVar202 * 1.5 + local_a40._0_4_ * -0.5 * fVar202 * fVar202 * fVar202;
                  auVar163._0_4_ = fVar202 * (float)local_860._0_4_;
                  auVar163._4_4_ = fVar202 * (float)local_860._4_4_;
                  auVar163._8_4_ = fVar202 * fStack_858;
                  auVar163._12_4_ = fVar202 * fStack_854;
                  auVar223 = vfmadd213ps_fma(auVar8,auVar163,local_9a0._0_16_);
                  auVar89 = vshufps_avx(auVar163,auVar163,0xc9);
                  auVar251 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                  auVar164._0_4_ = auVar163._0_4_ * auVar251._0_4_;
                  auVar164._4_4_ = auVar163._4_4_ * auVar251._4_4_;
                  auVar164._8_4_ = auVar163._8_4_ * auVar251._8_4_;
                  auVar164._12_4_ = auVar163._12_4_ * auVar251._12_4_;
                  auVar8 = vfmsub231ps_fma(auVar164,local_9a0._0_16_,auVar89);
                  auVar89 = vshufps_avx(auVar8,auVar8,0xc9);
                  auVar251 = vshufps_avx(auVar223,auVar223,0xc9);
                  auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                  auVar96._0_4_ = auVar223._0_4_ * auVar8._0_4_;
                  auVar96._4_4_ = auVar223._4_4_ * auVar8._4_4_;
                  auVar96._8_4_ = auVar223._8_4_ * auVar8._8_4_;
                  auVar96._12_4_ = auVar223._12_4_ * auVar8._12_4_;
                  auVar251 = vfmsub231ps_fma(auVar96,auVar89,auVar251);
                  auVar89 = vshufps_avx(auVar251,auVar251,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar185;
                    uVar81 = vmovlps_avx(auVar89);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar81;
                    (ray->Ng).field_0.field_0.z = auVar251._0_4_;
                    ray->u = fVar201;
                    ray->v = 0.0;
                    ray->primID = local_840._0_4_;
                    ray->geomID = uVar72;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_8d0 = vmovlps_avx(auVar89);
                    local_8c8 = auVar251._0_4_;
                    local_8c4 = fVar201;
                    local_8c0 = 0;
                    local_8bc = local_840._0_4_;
                    local_8b8 = uVar72;
                    local_8b4 = context->user->instID[0];
                    local_8b0 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar185;
                    local_a64 = -1;
                    local_a98.valid = &local_a64;
                    local_a98.geometryUserPtr = pGVar4->userPtr;
                    local_a98.context = context->user;
                    local_a98.hit = (RTCHitN *)&local_8d0;
                    local_a98.N = 1;
                    local_a98.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01164e02:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar230 = ZEXT1664(auVar230._0_16_);
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        (*p_Var5)(&local_a98);
                        if (*local_a98.valid == 0) goto LAB_01164e99;
                      }
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a98.hit;
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a98.hit + 4);
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a98.hit + 8);
                      *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                      *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                      *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                      *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                      *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                      *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                    }
                    else {
                      auVar230 = ZEXT1664(local_9a0._0_16_);
                      auVar240 = ZEXT464((uint)fVar200);
                      auVar256 = ZEXT1664(auVar272);
                      auVar267 = ZEXT1664(auVar114);
                      auVar279 = ZEXT1664(auVar85);
                      (*pGVar4->intersectionFilterN)(&local_a98);
                      if (*local_a98.valid != 0) goto LAB_01164e02;
LAB_01164e99:
                      (ray->super_RayK<1>).tfar = fVar200;
                    }
                  }
                }
              }
            }
          }
LAB_01164cef:
          fVar185 = (ray->super_RayK<1>).tfar;
          auVar110._4_4_ = fVar185;
          auVar110._0_4_ = fVar185;
          auVar110._8_4_ = fVar185;
          auVar110._12_4_ = fVar185;
          auVar110._16_4_ = fVar185;
          auVar110._20_4_ = fVar185;
          auVar110._24_4_ = fVar185;
          auVar110._28_4_ = fVar185;
          fVar200 = (ray->super_RayK<1>).tfar;
          auVar98 = vcmpps_avx(_local_7a0,auVar110,2);
          auVar98 = vandps_avx(auVar98,local_640);
        }
        auVar149._0_4_ = local_800._0_4_ + local_540._0_4_;
        auVar149._4_4_ = local_800._4_4_ + local_540._4_4_;
        auVar149._8_4_ = local_800._8_4_ + local_540._8_4_;
        auVar149._12_4_ = local_800._12_4_ + local_540._12_4_;
        auVar149._16_4_ = local_800._16_4_ + local_540._16_4_;
        auVar149._20_4_ = local_800._20_4_ + local_540._20_4_;
        auVar149._24_4_ = local_800._24_4_ + local_540._24_4_;
        auVar149._28_4_ = local_800._28_4_ + local_540._28_4_;
        auVar166._4_4_ = fVar200;
        auVar166._0_4_ = fVar200;
        auVar166._8_4_ = fVar200;
        auVar166._12_4_ = fVar200;
        auVar166._16_4_ = fVar200;
        auVar166._20_4_ = fVar200;
        auVar166._24_4_ = fVar200;
        auVar166._28_4_ = fVar200;
        auVar98 = vcmpps_avx(auVar149,auVar166,2);
        auVar194 = vpand_avx2(local_780,local_5e0);
        auVar98 = vandps_avx(auVar98,auVar194);
        auVar179._0_4_ = local_800._0_4_ + local_580._0_4_;
        auVar179._4_4_ = local_800._4_4_ + local_580._4_4_;
        auVar179._8_4_ = local_800._8_4_ + local_580._8_4_;
        auVar179._12_4_ = local_800._12_4_ + local_580._12_4_;
        auVar179._16_4_ = local_800._16_4_ + local_580._16_4_;
        auVar179._20_4_ = local_800._20_4_ + local_580._20_4_;
        auVar179._24_4_ = local_800._24_4_ + local_580._24_4_;
        auVar179._28_4_ = local_800._28_4_ + local_580._28_4_;
        auVar266 = vcmpps_avx(auVar179,auVar166,2);
        auVar194 = vandps_avx(_local_7e0,local_7c0);
        auVar194 = vandps_avx(auVar266,auVar194);
        auVar194 = vorps_avx(auVar98,auVar194);
        if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar194 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar194 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar194 >> 0x7f,0) != '\0') ||
              (auVar194 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar194 >> 0xbf,0) != '\0') ||
            (auVar194 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar194[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar194;
          auVar98 = vblendvps_avx(_local_580,local_540,auVar98);
          *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar98;
          uVar75 = vmovlps_avx(local_590);
          (&uStack_140)[uVar79 * 0xc] = uVar75;
          aiStack_138[uVar79 * 0x18] = local_aec + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    fVar200 = (ray->super_RayK<1>).tfar;
    fVar185 = (ray->super_RayK<1>).tfar;
    auVar143._4_4_ = fVar185;
    auVar143._0_4_ = fVar185;
    auVar143._8_4_ = fVar185;
    auVar143._12_4_ = fVar185;
    auVar143._16_4_ = fVar185;
    auVar143._20_4_ = fVar185;
    auVar143._24_4_ = fVar185;
    auVar143._28_4_ = fVar185;
    while( true ) {
      uVar71 = (uint)uVar79;
      if (uVar71 == 0) {
        auVar97._4_4_ = fVar200;
        auVar97._0_4_ = fVar200;
        auVar97._8_4_ = fVar200;
        auVar97._12_4_ = fVar200;
        auVar7 = vcmpps_avx(local_5a0,auVar97,2);
        uVar72 = vmovmskps_avx(auVar7);
        uVar78 = (ulong)((uint)uVar78 & uVar72);
        goto LAB_0116288a;
      }
      uVar75 = (ulong)(uVar71 - 1);
      lVar73 = uVar75 * 0x60;
      auVar98 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar125._0_4_ = auVar214._0_4_ + auVar98._0_4_;
      auVar125._4_4_ = auVar214._4_4_ + auVar98._4_4_;
      auVar125._8_4_ = auVar214._8_4_ + auVar98._8_4_;
      auVar125._12_4_ = auVar214._12_4_ + auVar98._12_4_;
      auVar125._16_4_ = auVar214._16_4_ + auVar98._16_4_;
      auVar125._20_4_ = auVar214._20_4_ + auVar98._20_4_;
      auVar125._24_4_ = auVar214._24_4_ + auVar98._24_4_;
      auVar125._28_4_ = auVar214._28_4_ + auVar98._28_4_;
      auVar266 = vcmpps_avx(auVar125,auVar143,2);
      auVar194 = vandps_avx(auVar266,*(undefined1 (*) [32])(auStack_180 + lVar73));
      local_540 = auVar194;
      auVar266 = *(undefined1 (*) [32])(auStack_180 + lVar73) & auVar266;
      if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar266 >> 0x7f,0) != '\0') ||
            (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar266 >> 0xbf,0) != '\0') ||
          (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar266[0x1f] < '\0') break;
      uVar79 = (ulong)(uVar71 - 1);
    }
    auVar104._8_4_ = 0x7f800000;
    auVar104._0_8_ = 0x7f8000007f800000;
    auVar104._12_4_ = 0x7f800000;
    auVar104._16_4_ = 0x7f800000;
    auVar104._20_4_ = 0x7f800000;
    auVar104._24_4_ = 0x7f800000;
    auVar104._28_4_ = 0x7f800000;
    auVar98 = vblendvps_avx(auVar104,auVar98,auVar194);
    auVar266 = vshufps_avx(auVar98,auVar98,0xb1);
    auVar266 = vminps_avx(auVar98,auVar266);
    auVar238 = vshufpd_avx(auVar266,auVar266,5);
    auVar266 = vminps_avx(auVar266,auVar238);
    auVar238 = vpermpd_avx2(auVar266,0x4e);
    auVar266 = vminps_avx(auVar266,auVar238);
    auVar98 = vcmpps_avx(auVar98,auVar266,0);
    auVar266 = auVar194 & auVar98;
    if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar266 >> 0x7f,0) != '\0') ||
          (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar266 >> 0xbf,0) != '\0') ||
        (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar266[0x1f] < '\0') {
      auVar194 = vandps_avx(auVar98,auVar194);
    }
    uVar74 = vmovmskps_avx(auVar194);
    iVar11 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      iVar11 = iVar11 + 1;
    }
    *(undefined4 *)(local_540 + (uint)(iVar11 << 2)) = 0;
    uVar79 = (&uStack_140)[uVar75 * 0xc];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar79;
    local_aec = aiStack_138[uVar75 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar73) = local_540;
    uVar74 = uVar71 - 1;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar74 = uVar71;
    }
    uVar77 = (undefined4)uVar79;
    auVar126._4_4_ = uVar77;
    auVar126._0_4_ = uVar77;
    auVar126._8_4_ = uVar77;
    auVar126._12_4_ = uVar77;
    auVar126._16_4_ = uVar77;
    auVar126._20_4_ = uVar77;
    auVar126._24_4_ = uVar77;
    auVar126._28_4_ = uVar77;
    auVar89 = vmovshdup_avx(auVar87);
    auVar89 = vsubps_avx(auVar89,auVar87);
    auVar105._0_4_ = auVar89._0_4_;
    auVar105._4_4_ = auVar105._0_4_;
    auVar105._8_4_ = auVar105._0_4_;
    auVar105._12_4_ = auVar105._0_4_;
    auVar105._16_4_ = auVar105._0_4_;
    auVar105._20_4_ = auVar105._0_4_;
    auVar105._24_4_ = auVar105._0_4_;
    auVar105._28_4_ = auVar105._0_4_;
    auVar89 = vfmadd132ps_fma(auVar105,auVar126,_DAT_01f7b040);
    _local_580 = ZEXT1632(auVar89);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_580 + (uint)(iVar11 << 2));
    uVar79 = (ulong)uVar74;
    uVar75 = local_840._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }